

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_hn<embree::sse2::OrientedCurve1Intersector1<embree::HermiteCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  long lVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined3 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined6 uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  bool bVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  undefined2 uVar107;
  float fVar70;
  float fVar108;
  float fVar109;
  vfloat_impl<4> p00;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  float fVar110;
  float fVar134;
  float fVar135;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar148;
  float fVar149;
  vfloat4 v;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  undefined8 uVar151;
  float fVar160;
  vfloat4 v_1;
  float fVar159;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar172;
  float fVar173;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar200;
  float fVar201;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar205;
  float fVar206;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar220;
  float fVar221;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar222;
  float fVar223;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar263;
  float fVar266;
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  float fVar264;
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar283;
  float fVar286;
  vfloat4 a;
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  float fVar284;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar303;
  float fVar306;
  vfloat4 a_2;
  float fVar309;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar312;
  float fVar313;
  float fVar322;
  float fVar324;
  float fVar326;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar318 [16];
  float fVar323;
  float fVar325;
  float fVar327;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_3e8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  Primitive *local_2a0;
  RTCFilterFunctionNArguments local_298;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  float afStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  float local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar104 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 uVar106;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  
  PVar13 = prim[1];
  uVar55 = (ulong)(byte)PVar13;
  lVar61 = uVar55 * 0x25;
  pPVar4 = prim + lVar61 + 6;
  fVar149 = *(float *)(pPVar4 + 0xc);
  fVar150 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar149;
  fVar159 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar149;
  fVar160 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar149;
  fVar136 = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar148 = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar149 = fVar149 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar14 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar124._8_4_ = 0;
  auVar124._0_8_ = uVar56;
  auVar124._12_2_ = uVar107;
  auVar124._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar138._12_4_ = auVar124._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar56;
  auVar138._10_2_ = uVar107;
  auVar71._10_6_ = auVar138._10_6_;
  auVar71._8_2_ = uVar107;
  auVar71._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar33._4_8_ = auVar71._8_8_;
  auVar33._2_2_ = uVar107;
  auVar33._0_2_ = uVar107;
  fVar328 = (float)((int)sVar69 >> 8);
  fVar334 = (float)(auVar33._0_4_ >> 0x18);
  fVar336 = (float)(auVar71._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar56;
  auVar113._12_2_ = uVar107;
  auVar113._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar56;
  auVar112._10_2_ = uVar107;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar107;
  auVar111._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar34._4_8_ = auVar111._8_8_;
  auVar34._2_2_ = uVar107;
  auVar34._0_2_ = uVar107;
  fVar161 = (float)((int)sVar69 >> 8);
  fVar172 = (float)(auVar34._0_4_ >> 0x18);
  fVar173 = (float)(auVar111._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar56;
  auVar116._12_2_ = uVar107;
  auVar116._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar56;
  auVar115._10_2_ = uVar107;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar107;
  auVar114._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar35._4_8_ = auVar114._8_8_;
  auVar35._2_2_ = uVar107;
  auVar35._0_2_ = uVar107;
  fVar202 = (float)((int)sVar69 >> 8);
  fVar205 = (float)(auVar35._0_4_ >> 0x18);
  fVar206 = (float)(auVar114._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 0xf + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar56;
  auVar119._12_2_ = uVar107;
  auVar119._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar56;
  auVar118._10_2_ = uVar107;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar107;
  auVar117._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar36._4_8_ = auVar117._8_8_;
  auVar36._2_2_ = uVar107;
  auVar36._0_2_ = uVar107;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar108 = (float)(auVar36._0_4_ >> 0x18);
  fVar109 = (float)(auVar117._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar56;
  auVar177._12_2_ = uVar107;
  auVar177._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar56;
  auVar176._10_2_ = uVar107;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar107;
  auVar175._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar37._4_8_ = auVar175._8_8_;
  auVar37._2_2_ = uVar107;
  auVar37._0_2_ = uVar107;
  fVar207 = (float)((int)sVar69 >> 8);
  fVar220 = (float)(auVar37._0_4_ >> 0x18);
  fVar221 = (float)(auVar175._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar55 + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar56;
  auVar180._12_2_ = uVar107;
  auVar180._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar56;
  auVar179._10_2_ = uVar107;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar107;
  auVar178._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar38._4_8_ = auVar178._8_8_;
  auVar38._2_2_ = uVar107;
  auVar38._0_2_ = uVar107;
  fVar249 = (float)((int)sVar69 >> 8);
  fVar263 = (float)(auVar38._0_4_ >> 0x18);
  fVar266 = (float)(auVar178._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 0x1a + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar56;
  auVar183._12_2_ = uVar107;
  auVar183._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar56;
  auVar182._10_2_ = uVar107;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar107;
  auVar181._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar39._4_8_ = auVar181._8_8_;
  auVar39._2_2_ = uVar107;
  auVar39._0_2_ = uVar107;
  fVar222 = (float)((int)sVar69 >> 8);
  fVar233 = (float)(auVar39._0_4_ >> 0x18);
  fVar238 = (float)(auVar181._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 0x1b + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar56;
  auVar186._12_2_ = uVar107;
  auVar186._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar56;
  auVar185._10_2_ = uVar107;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar107;
  auVar184._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar40._4_8_ = auVar184._8_8_;
  auVar40._2_2_ = uVar107;
  auVar40._0_2_ = uVar107;
  fVar271 = (float)((int)sVar69 >> 8);
  fVar283 = (float)(auVar40._0_4_ >> 0x18);
  fVar286 = (float)(auVar184._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar55 * 0x1c + 6);
  uVar106 = (undefined1)((uint)uVar14 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar14 >> 0x10);
  uVar151 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar14));
  uVar106 = (undefined1)((uint)uVar14 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar151 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar56;
  auVar189._12_2_ = uVar107;
  auVar189._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar151 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar56;
  auVar188._10_2_ = uVar107;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar107;
  auVar187._0_8_ = uVar56;
  uVar107 = (undefined2)uVar32;
  auVar41._4_8_ = auVar187._8_8_;
  auVar41._2_2_ = uVar107;
  auVar41._0_2_ = uVar107;
  fVar110 = (float)((int)sVar69 >> 8);
  fVar134 = (float)(auVar41._0_4_ >> 0x18);
  fVar135 = (float)(auVar187._8_4_ >> 0x18);
  fVar312 = fVar136 * fVar328 + fVar148 * fVar161 + fVar149 * fVar202;
  fVar322 = fVar136 * fVar334 + fVar148 * fVar172 + fVar149 * fVar205;
  fVar324 = fVar136 * fVar336 + fVar148 * fVar173 + fVar149 * fVar206;
  fVar326 = fVar136 * (float)(auVar138._12_4_ >> 0x18) +
            fVar148 * (float)(auVar112._12_4_ >> 0x18) + fVar149 * (float)(auVar115._12_4_ >> 0x18);
  fVar291 = fVar136 * fVar70 + fVar148 * fVar207 + fVar149 * fVar249;
  fVar303 = fVar136 * fVar108 + fVar148 * fVar220 + fVar149 * fVar263;
  fVar306 = fVar136 * fVar109 + fVar148 * fVar221 + fVar149 * fVar266;
  fVar309 = fVar136 * (float)(auVar118._12_4_ >> 0x18) +
            fVar148 * (float)(auVar176._12_4_ >> 0x18) + fVar149 * (float)(auVar179._12_4_ >> 0x18);
  fVar174 = fVar136 * fVar222 + fVar148 * fVar271 + fVar149 * fVar110;
  fVar200 = fVar136 * fVar233 + fVar148 * fVar283 + fVar149 * fVar134;
  fVar201 = fVar136 * fVar238 + fVar148 * fVar286 + fVar149 * fVar135;
  fVar136 = fVar136 * (float)(auVar182._12_4_ >> 0x18) +
            fVar148 * (float)(auVar185._12_4_ >> 0x18) + fVar149 * (float)(auVar188._12_4_ >> 0x18);
  fVar329 = fVar328 * fVar150 + fVar161 * fVar159 + fVar202 * fVar160;
  fVar334 = fVar334 * fVar150 + fVar172 * fVar159 + fVar205 * fVar160;
  fVar336 = fVar336 * fVar150 + fVar173 * fVar159 + fVar206 * fVar160;
  fVar338 = (float)(auVar138._12_4_ >> 0x18) * fVar150 +
            (float)(auVar112._12_4_ >> 0x18) * fVar159 + (float)(auVar115._12_4_ >> 0x18) * fVar160;
  fVar249 = fVar70 * fVar150 + fVar207 * fVar159 + fVar249 * fVar160;
  fVar263 = fVar108 * fVar150 + fVar220 * fVar159 + fVar263 * fVar160;
  fVar266 = fVar109 * fVar150 + fVar221 * fVar159 + fVar266 * fVar160;
  fVar328 = (float)(auVar118._12_4_ >> 0x18) * fVar150 +
            (float)(auVar176._12_4_ >> 0x18) * fVar159 + (float)(auVar179._12_4_ >> 0x18) * fVar160;
  fVar222 = fVar150 * fVar222 + fVar159 * fVar271 + fVar160 * fVar110;
  fVar233 = fVar150 * fVar233 + fVar159 * fVar283 + fVar160 * fVar134;
  fVar238 = fVar150 * fVar238 + fVar159 * fVar286 + fVar160 * fVar135;
  fVar271 = fVar150 * (float)(auVar182._12_4_ >> 0x18) +
            fVar159 * (float)(auVar185._12_4_ >> 0x18) + fVar160 * (float)(auVar188._12_4_ >> 0x18);
  fVar149 = (float)DAT_01f80d30;
  fVar70 = DAT_01f80d30._4_4_;
  fVar108 = DAT_01f80d30._8_4_;
  fVar109 = DAT_01f80d30._12_4_;
  uVar63 = -(uint)(fVar149 <= ABS(fVar312));
  uVar65 = -(uint)(fVar70 <= ABS(fVar322));
  uVar67 = -(uint)(fVar108 <= ABS(fVar324));
  uVar68 = -(uint)(fVar109 <= ABS(fVar326));
  auVar314._0_4_ = (uint)fVar312 & uVar63;
  auVar314._4_4_ = (uint)fVar322 & uVar65;
  auVar314._8_4_ = (uint)fVar324 & uVar67;
  auVar314._12_4_ = (uint)fVar326 & uVar68;
  auVar152._0_4_ = ~uVar63 & (uint)fVar149;
  auVar152._4_4_ = ~uVar65 & (uint)fVar70;
  auVar152._8_4_ = ~uVar67 & (uint)fVar108;
  auVar152._12_4_ = ~uVar68 & (uint)fVar109;
  auVar152 = auVar152 | auVar314;
  uVar63 = -(uint)(fVar149 <= ABS(fVar291));
  uVar65 = -(uint)(fVar70 <= ABS(fVar303));
  uVar67 = -(uint)(fVar108 <= ABS(fVar306));
  uVar68 = -(uint)(fVar109 <= ABS(fVar309));
  auVar294._0_4_ = (uint)fVar291 & uVar63;
  auVar294._4_4_ = (uint)fVar303 & uVar65;
  auVar294._8_4_ = (uint)fVar306 & uVar67;
  auVar294._12_4_ = (uint)fVar309 & uVar68;
  auVar203._0_4_ = ~uVar63 & (uint)fVar149;
  auVar203._4_4_ = ~uVar65 & (uint)fVar70;
  auVar203._8_4_ = ~uVar67 & (uint)fVar108;
  auVar203._12_4_ = ~uVar68 & (uint)fVar109;
  auVar203 = auVar203 | auVar294;
  uVar63 = -(uint)(fVar149 <= ABS(fVar174));
  uVar65 = -(uint)(fVar70 <= ABS(fVar200));
  uVar67 = -(uint)(fVar108 <= ABS(fVar201));
  uVar68 = -(uint)(fVar109 <= ABS(fVar136));
  auVar190._0_4_ = (uint)fVar174 & uVar63;
  auVar190._4_4_ = (uint)fVar200 & uVar65;
  auVar190._8_4_ = (uint)fVar201 & uVar67;
  auVar190._12_4_ = (uint)fVar136 & uVar68;
  auVar208._0_4_ = ~uVar63 & (uint)fVar149;
  auVar208._4_4_ = ~uVar65 & (uint)fVar70;
  auVar208._8_4_ = ~uVar67 & (uint)fVar108;
  auVar208._12_4_ = ~uVar68 & (uint)fVar109;
  auVar208 = auVar208 | auVar190;
  auVar71 = rcpps(_DAT_01f80d30,auVar152);
  fVar149 = auVar71._0_4_;
  fVar109 = auVar71._4_4_;
  fVar161 = auVar71._8_4_;
  fVar207 = auVar71._12_4_;
  fVar149 = (1.0 - auVar152._0_4_ * fVar149) * fVar149 + fVar149;
  fVar109 = (1.0 - auVar152._4_4_ * fVar109) * fVar109 + fVar109;
  fVar161 = (1.0 - auVar152._8_4_ * fVar161) * fVar161 + fVar161;
  fVar207 = (1.0 - auVar152._12_4_ * fVar207) * fVar207 + fVar207;
  auVar71 = rcpps(auVar71,auVar203);
  fVar70 = auVar71._0_4_;
  fVar110 = auVar71._4_4_;
  fVar172 = auVar71._8_4_;
  fVar220 = auVar71._12_4_;
  fVar70 = (1.0 - auVar203._0_4_ * fVar70) * fVar70 + fVar70;
  fVar110 = (1.0 - auVar203._4_4_ * fVar110) * fVar110 + fVar110;
  fVar172 = (1.0 - auVar203._8_4_ * fVar172) * fVar172 + fVar172;
  fVar220 = (1.0 - auVar203._12_4_ * fVar220) * fVar220 + fVar220;
  auVar71 = rcpps(auVar71,auVar208);
  fVar108 = auVar71._0_4_;
  fVar134 = auVar71._4_4_;
  fVar173 = auVar71._8_4_;
  fVar221 = auVar71._12_4_;
  fVar108 = (1.0 - auVar208._0_4_ * fVar108) * fVar108 + fVar108;
  fVar134 = (1.0 - auVar208._4_4_ * fVar134) * fVar134 + fVar134;
  fVar173 = (1.0 - auVar208._8_4_ * fVar173) * fVar173 + fVar173;
  fVar221 = (1.0 - auVar208._12_4_ * fVar221) * fVar221 + fVar221;
  fVar283 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  uVar56 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar107 = (undefined2)(uVar56 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar56;
  auVar72._12_2_ = uVar107;
  auVar72._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar56 >> 0x20);
  auVar257._12_4_ = auVar72._12_4_;
  auVar257._8_2_ = 0;
  auVar257._0_8_ = uVar56;
  auVar257._10_2_ = uVar107;
  auVar140._10_6_ = auVar257._10_6_;
  auVar140._8_2_ = uVar107;
  auVar140._0_8_ = uVar56;
  uVar107 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar140._8_8_;
  auVar42._2_2_ = uVar107;
  auVar42._0_2_ = uVar107;
  fVar135 = (float)(auVar42._0_4_ >> 0x10);
  fVar174 = (float)(auVar140._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar55 * 0xb + 6);
  uVar107 = (undefined2)(uVar57 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar57;
  auVar155._12_2_ = uVar107;
  auVar155._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar57 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar57;
  auVar154._10_2_ = uVar107;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar107;
  auVar153._0_8_ = uVar57;
  uVar107 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar153._8_8_;
  auVar43._2_2_ = uVar107;
  auVar43._0_2_ = uVar107;
  uVar5 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar107 = (undefined2)(uVar5 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar5;
  auVar75._12_2_ = uVar107;
  auVar75._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar5 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar5;
  auVar74._10_2_ = uVar107;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar107;
  auVar73._0_8_ = uVar5;
  uVar107 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar73._8_8_;
  auVar44._2_2_ = uVar107;
  auVar44._0_2_ = uVar107;
  fVar136 = (float)(auVar44._0_4_ >> 0x10);
  fVar200 = (float)(auVar73._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar55 * 0xd + 6);
  uVar107 = (undefined2)(uVar6 >> 0x30);
  auVar211._8_4_ = 0;
  auVar211._0_8_ = uVar6;
  auVar211._12_2_ = uVar107;
  auVar211._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar6 >> 0x20);
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._8_2_ = 0;
  auVar210._0_8_ = uVar6;
  auVar210._10_2_ = uVar107;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._8_2_ = uVar107;
  auVar209._0_8_ = uVar6;
  uVar107 = (undefined2)(uVar6 >> 0x10);
  auVar45._4_8_ = auVar209._8_8_;
  auVar45._2_2_ = uVar107;
  auVar45._0_2_ = uVar107;
  uVar7 = *(ulong *)(prim + uVar55 * 0x12 + 6);
  uVar107 = (undefined2)(uVar7 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar7;
  auVar78._12_2_ = uVar107;
  auVar78._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar7 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar7;
  auVar77._10_2_ = uVar107;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar107;
  auVar76._0_8_ = uVar7;
  uVar107 = (undefined2)(uVar7 >> 0x10);
  auVar46._4_8_ = auVar76._8_8_;
  auVar46._2_2_ = uVar107;
  auVar46._0_2_ = uVar107;
  fVar148 = (float)(auVar46._0_4_ >> 0x10);
  fVar201 = (float)(auVar76._8_4_ >> 0x10);
  uVar60 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar55 * 2 + uVar60 + 6);
  uVar107 = (undefined2)(uVar8 >> 0x30);
  auVar254._8_4_ = 0;
  auVar254._0_8_ = uVar8;
  auVar254._12_2_ = uVar107;
  auVar254._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar8 >> 0x20);
  auVar253._12_4_ = auVar254._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar8;
  auVar253._10_2_ = uVar107;
  auVar252._10_6_ = auVar253._10_6_;
  auVar252._8_2_ = uVar107;
  auVar252._0_8_ = uVar8;
  uVar107 = (undefined2)(uVar8 >> 0x10);
  auVar47._4_8_ = auVar252._8_8_;
  auVar47._2_2_ = uVar107;
  auVar47._0_2_ = uVar107;
  uVar60 = *(ulong *)(prim + uVar60 + 6);
  uVar107 = (undefined2)(uVar60 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar60;
  auVar81._12_2_ = uVar107;
  auVar81._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar60 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar60;
  auVar80._10_2_ = uVar107;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar107;
  auVar79._0_8_ = uVar60;
  uVar107 = (undefined2)(uVar60 >> 0x10);
  auVar48._4_8_ = auVar79._8_8_;
  auVar48._2_2_ = uVar107;
  auVar48._0_2_ = uVar107;
  fVar150 = (float)(auVar48._0_4_ >> 0x10);
  fVar202 = (float)(auVar79._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar55 * 0x18 + 6);
  uVar107 = (undefined2)(uVar9 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar9;
  auVar276._12_2_ = uVar107;
  auVar276._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar9 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar9;
  auVar275._10_2_ = uVar107;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar107;
  auVar274._0_8_ = uVar9;
  uVar107 = (undefined2)(uVar9 >> 0x10);
  auVar49._4_8_ = auVar274._8_8_;
  auVar49._2_2_ = uVar107;
  auVar49._0_2_ = uVar107;
  uVar10 = *(ulong *)(prim + uVar55 * 0x1d + 6);
  uVar107 = (undefined2)(uVar10 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar10;
  auVar84._12_2_ = uVar107;
  auVar84._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar10 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar10;
  auVar83._10_2_ = uVar107;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar107;
  auVar82._0_8_ = uVar10;
  uVar107 = (undefined2)(uVar10 >> 0x10);
  auVar50._4_8_ = auVar82._8_8_;
  auVar50._2_2_ = uVar107;
  auVar50._0_2_ = uVar107;
  fVar159 = (float)(auVar50._0_4_ >> 0x10);
  fVar205 = (float)(auVar82._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar55 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar107 = (undefined2)(uVar11 >> 0x30);
  auVar297._8_4_ = 0;
  auVar297._0_8_ = uVar11;
  auVar297._12_2_ = uVar107;
  auVar297._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar11 >> 0x20);
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._8_2_ = 0;
  auVar296._0_8_ = uVar11;
  auVar296._10_2_ = uVar107;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._8_2_ = uVar107;
  auVar295._0_8_ = uVar11;
  uVar107 = (undefined2)(uVar11 >> 0x10);
  auVar51._4_8_ = auVar295._8_8_;
  auVar51._2_2_ = uVar107;
  auVar51._0_2_ = uVar107;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar55) + 6);
  uVar107 = (undefined2)(uVar12 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar12;
  auVar87._12_2_ = uVar107;
  auVar87._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar12 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar12;
  auVar86._10_2_ = uVar107;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar107;
  auVar85._0_8_ = uVar12;
  uVar107 = (undefined2)(uVar12 >> 0x10);
  auVar52._4_8_ = auVar85._8_8_;
  auVar52._2_2_ = uVar107;
  auVar52._0_2_ = uVar107;
  fVar160 = (float)(auVar52._0_4_ >> 0x10);
  fVar206 = (float)(auVar85._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar55 * 0x23 + 6);
  uVar107 = (undefined2)(uVar55 >> 0x30);
  auVar317._8_4_ = 0;
  auVar317._0_8_ = uVar55;
  auVar317._12_2_ = uVar107;
  auVar317._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar55 >> 0x20);
  auVar316._12_4_ = auVar317._12_4_;
  auVar316._8_2_ = 0;
  auVar316._0_8_ = uVar55;
  auVar316._10_2_ = uVar107;
  auVar315._10_6_ = auVar316._10_6_;
  auVar315._8_2_ = uVar107;
  auVar315._0_8_ = uVar55;
  uVar107 = (undefined2)(uVar55 >> 0x10);
  auVar53._4_8_ = auVar315._8_8_;
  auVar53._2_2_ = uVar107;
  auVar53._0_2_ = uVar107;
  auVar156._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar135) * fVar283 + fVar135) - fVar334) *
                fVar109,((((float)(int)(short)uVar57 - (float)(int)(short)uVar56) * fVar283 +
                         (float)(int)(short)uVar56) - fVar329) * fVar149);
  auVar156._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar174) * fVar283 + fVar174) - fVar336) * fVar161;
  auVar156._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar257._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar257._12_4_ >> 0x10)) - fVar338) * fVar207;
  auVar212._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar283 + (float)(int)(short)uVar5)
       - fVar329) * fVar149;
  auVar212._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar136) * fVar283 + fVar136) - fVar334) * fVar109;
  auVar212._8_4_ =
       ((((float)(auVar209._8_4_ >> 0x10) - fVar200) * fVar283 + fVar200) - fVar336) * fVar161;
  auVar212._12_4_ =
       ((((float)(auVar210._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar338) * fVar207;
  auVar255._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar148) * fVar283 + fVar148) - fVar263) *
                fVar110,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar283 +
                         (float)(int)(short)uVar7) - fVar249) * fVar70);
  auVar255._8_4_ =
       ((((float)(auVar252._8_4_ >> 0x10) - fVar201) * fVar283 + fVar201) - fVar266) * fVar172;
  auVar255._12_4_ =
       ((((float)(auVar253._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar328) * fVar220;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar60) * fVar283 +
        (float)(int)(short)uVar60) - fVar249) * fVar70;
  auVar277._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar150) * fVar283 + fVar150) - fVar263) * fVar110;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar202) * fVar283 + fVar202) - fVar266) * fVar172;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar328) * fVar220;
  auVar298._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar159) * fVar283 + fVar159) - fVar233) *
                fVar134,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar283 +
                         (float)(int)(short)uVar10) - fVar222) * fVar108);
  auVar298._8_4_ =
       ((((float)(auVar295._8_4_ >> 0x10) - fVar205) * fVar283 + fVar205) - fVar238) * fVar173;
  auVar298._12_4_ =
       ((((float)(auVar296._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar271) * fVar221;
  auVar318._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar12) * fVar283 +
        (float)(int)(short)uVar12) - fVar222) * fVar108;
  auVar318._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar160) * fVar283 + fVar160) - fVar233) * fVar134;
  auVar318._8_4_ =
       ((((float)(auVar315._8_4_ >> 0x10) - fVar206) * fVar283 + fVar206) - fVar238) * fVar173;
  auVar318._12_4_ =
       ((((float)(auVar316._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar283 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar271) * fVar221;
  auVar137._8_4_ = auVar156._8_4_;
  auVar137._0_8_ = auVar156._0_8_;
  auVar137._12_4_ = auVar156._12_4_;
  auVar138 = minps(auVar137,auVar212);
  auVar88._8_4_ = auVar255._8_4_;
  auVar88._0_8_ = auVar255._0_8_;
  auVar88._12_4_ = auVar255._12_4_;
  auVar71 = minps(auVar88,auVar277);
  auVar138 = maxps(auVar138,auVar71);
  auVar89._8_4_ = auVar298._8_4_;
  auVar89._0_8_ = auVar298._0_8_;
  auVar89._12_4_ = auVar298._12_4_;
  auVar71 = minps(auVar89,auVar318);
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar120._4_4_ = uVar14;
  auVar120._0_4_ = uVar14;
  auVar120._8_4_ = uVar14;
  auVar120._12_4_ = uVar14;
  auVar71 = maxps(auVar71,auVar120);
  auVar71 = maxps(auVar138,auVar71);
  local_1c8 = auVar71._0_4_ * 0.99999964;
  fStack_1c4 = auVar71._4_4_ * 0.99999964;
  fStack_1c0 = auVar71._8_4_ * 0.99999964;
  fStack_1bc = auVar71._12_4_ * 0.99999964;
  auVar71 = maxps(auVar156,auVar212);
  auVar138 = maxps(auVar255,auVar277);
  auVar71 = minps(auVar71,auVar138);
  auVar138 = maxps(auVar298,auVar318);
  fVar149 = (ray->super_RayK<1>).tfar;
  auVar90._4_4_ = fVar149;
  auVar90._0_4_ = fVar149;
  auVar90._8_4_ = fVar149;
  auVar90._12_4_ = fVar149;
  auVar138 = minps(auVar138,auVar90);
  auVar71 = minps(auVar71,auVar138);
  uVar63 = (uint)(byte)PVar13;
  auVar121._0_4_ = -(uint)(uVar63 != 0 && local_1c8 <= auVar71._0_4_ * 1.0000004);
  auVar121._4_4_ = -(uint)(1 < uVar63 && fStack_1c4 <= auVar71._4_4_ * 1.0000004);
  auVar121._8_4_ = -(uint)(2 < uVar63 && fStack_1c0 <= auVar71._8_4_ * 1.0000004);
  auVar121._12_4_ = -(uint)(3 < uVar63 && fStack_1bc <= auVar71._12_4_ * 1.0000004);
  uVar63 = movmskps(uVar63,auVar121);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_2a0 = prim;
LAB_00b2d5ea:
  lVar61 = 0;
  if ((ulong)uVar63 != 0) {
    for (; (uVar63 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
    }
  }
  uVar65 = *(uint *)(local_2a0 + lVar61 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[*(uint *)(local_2a0 + 2)].ptr;
  local_338._0_4_ = pGVar15->fnumTimeSegments;
  fVar149 = (pGVar15->time_range).lower;
  fVar70 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar149) /
           ((pGVar15->time_range).upper - fVar149)) * pGVar15->fnumTimeSegments;
  fVar149 = floorf(fVar70);
  if ((float)local_338._0_4_ + -1.0 <= fVar149) {
    fVar149 = (float)local_338._0_4_ + -1.0;
  }
  fVar108 = 0.0;
  if (0.0 <= fVar149) {
    fVar108 = fVar149;
  }
  local_340 = (ulong)uVar65;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar65 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar59 = (long)(int)fVar108 * 0x38;
  lVar17 = *(long *)(_Var16 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(_Var16 + lVar59) + lVar17 * uVar56);
  fVar149 = *pfVar1;
  fVar109 = pfVar1[1];
  fVar110 = pfVar1[2];
  fVar134 = pfVar1[3];
  lVar61 = uVar56 + 1;
  pfVar1 = (float *)(*(long *)(_Var16 + lVar59) + lVar17 * lVar61);
  fVar135 = *pfVar1;
  fVar136 = pfVar1[1];
  fVar148 = pfVar1[2];
  fVar150 = pfVar1[3];
  p_Var18 = pGVar15[4].occlusionFilterN;
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar19 = *(long *)(lVar17 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(lVar17 + lVar59) + lVar19 * uVar56);
  fVar159 = *pfVar1;
  fVar160 = pfVar1[1];
  fVar161 = pfVar1[2];
  fVar172 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar17 + lVar59) + lVar19 * lVar61);
  fVar173 = *pfVar1;
  fVar174 = pfVar1[1];
  fVar200 = pfVar1[2];
  fVar201 = pfVar1[3];
  _Var20 = pGVar15[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar19 = *(long *)(_Var20 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(_Var20 + lVar59) + lVar19 * uVar56);
  pfVar2 = (float *)(*(long *)(_Var20 + lVar59) + lVar19 * lVar61);
  pfVar3 = (float *)(*(long *)(p_Var18 + lVar59) + *(long *)(p_Var18 + lVar59 + 0x10) * uVar56);
  fVar70 = fVar70 - fVar108;
  fVar108 = *pfVar3 * 0.33333334 + fVar149;
  fVar202 = pfVar3[1] * 0.33333334 + fVar109;
  fVar205 = pfVar3[2] * 0.33333334 + fVar110;
  fVar206 = pfVar3[3] * 0.33333334 + fVar134;
  pfVar3 = (float *)(*(long *)(p_Var18 + lVar59) + *(long *)(p_Var18 + lVar59 + 0x10) * lVar61);
  fVar222 = fVar135 - *pfVar3 * 0.33333334;
  fVar283 = fVar136 - pfVar3[1] * 0.33333334;
  fVar303 = fVar148 - pfVar3[2] * 0.33333334;
  fVar309 = fVar150 - pfVar3[3] * 0.33333334;
  fVar249 = *pfVar1 * 0.33333334 + fVar159;
  fVar286 = pfVar1[1] * 0.33333334 + fVar160;
  fVar326 = pfVar1[2] * 0.33333334 + fVar161;
  fVar329 = pfVar1[3] * 0.33333334 + fVar172;
  fVar334 = fVar173 - *pfVar2 * 0.33333334;
  fVar338 = fVar174 - pfVar2[1] * 0.33333334;
  fVar239 = fVar200 - pfVar2[2] * 0.33333334;
  fVar244 = fVar201 - pfVar2[3] * 0.33333334;
  fVar207 = fVar222 * 0.0;
  fVar220 = fVar283 * 0.0;
  fVar221 = fVar303 * 0.0;
  fVar266 = fVar309 * 0.0;
  fVar263 = fVar135 * 0.0 + fVar207;
  fVar328 = fVar136 * 0.0 + fVar220;
  fVar233 = fVar148 * 0.0 + fVar221;
  fVar271 = fVar150 * 0.0 + fVar266;
  fVar272 = fVar108 * 0.0;
  fVar284 = fVar202 * 0.0;
  fVar287 = fVar205 * 0.0;
  fVar289 = fVar206 * 0.0;
  fVar238 = fVar272 + fVar263 + fVar149;
  fVar291 = fVar284 + fVar328 + fVar109;
  fVar306 = fVar287 + fVar233 + fVar110;
  fVar312 = fVar289 + fVar271 + fVar134;
  fVar263 = (fVar108 * 3.0 + fVar263) - fVar149 * 3.0;
  fVar328 = (fVar202 * 3.0 + fVar328) - fVar109 * 3.0;
  fVar233 = (fVar205 * 3.0 + fVar233) - fVar110 * 3.0;
  fVar271 = (fVar206 * 3.0 + fVar271) - fVar134 * 3.0;
  fVar273 = fVar334 * 0.0;
  fVar285 = fVar338 * 0.0;
  fVar288 = fVar239 * 0.0;
  fVar290 = fVar244 * 0.0;
  fVar108 = fVar173 * 0.0 + fVar273;
  fVar202 = fVar174 * 0.0 + fVar285;
  fVar205 = fVar200 * 0.0 + fVar288;
  fVar206 = fVar201 * 0.0 + fVar290;
  fVar292 = fVar249 * 0.0;
  fVar304 = fVar286 * 0.0;
  fVar307 = fVar326 * 0.0;
  fVar310 = fVar329 * 0.0;
  fVar336 = fVar292 + fVar108 + fVar159;
  fVar234 = fVar304 + fVar202 + fVar160;
  fVar240 = fVar307 + fVar205 + fVar161;
  fVar245 = fVar310 + fVar206 + fVar172;
  fVar322 = (fVar249 * 3.0 + fVar108) - fVar159 * 3.0;
  fVar324 = (fVar286 * 3.0 + fVar202) - fVar160 * 3.0;
  fVar326 = (fVar326 * 3.0 + fVar205) - fVar161 * 3.0;
  fVar329 = (fVar329 * 3.0 + fVar206) - fVar172 * 3.0;
  fVar206 = fVar207 + fVar135 + fVar272 + fVar149 * 0.0;
  fVar220 = fVar220 + fVar136 + fVar284 + fVar109 * 0.0;
  fVar249 = fVar221 + fVar148 + fVar287 + fVar110 * 0.0;
  fVar286 = fVar266 + fVar150 + fVar289 + fVar134 * 0.0;
  fVar202 = ((fVar135 * 3.0 - fVar222 * 3.0) + fVar272) - fVar149 * 0.0;
  fVar205 = ((fVar136 * 3.0 - fVar283 * 3.0) + fVar284) - fVar109 * 0.0;
  fVar207 = ((fVar148 * 3.0 - fVar303 * 3.0) + fVar287) - fVar110 * 0.0;
  fVar221 = ((fVar150 * 3.0 - fVar309 * 3.0) + fVar289) - fVar134 * 0.0;
  fVar110 = fVar273 + fVar173 + fVar292 + fVar159 * 0.0;
  fVar134 = fVar285 + fVar174 + fVar304 + fVar160 * 0.0;
  fVar135 = fVar288 + fVar200 + fVar307 + fVar161 * 0.0;
  fVar136 = fVar290 + fVar201 + fVar310 + fVar172 * 0.0;
  fVar149 = ((fVar173 * 3.0 - fVar334 * 3.0) + fVar292) - fVar159 * 0.0;
  fVar108 = ((fVar174 * 3.0 - fVar338 * 3.0) + fVar304) - fVar160 * 0.0;
  fVar109 = ((fVar200 * 3.0 - fVar239 * 3.0) + fVar307) - fVar161 * 0.0;
  fVar173 = ((fVar201 * 3.0 - fVar244 * 3.0) + fVar310) - fVar172 * 0.0;
  fVar239 = fVar328 * fVar336 - fVar234 * fVar263;
  fVar244 = fVar233 * fVar234 - fVar240 * fVar328;
  fVar240 = fVar263 * fVar240 - fVar336 * fVar233;
  fVar245 = fVar271 * fVar245 - fVar245 * fVar271;
  fVar222 = fVar328 * fVar322 - fVar324 * fVar263;
  fVar336 = fVar233 * fVar324 - fVar326 * fVar328;
  fVar326 = fVar263 * fVar326 - fVar322 * fVar233;
  fVar309 = fVar205 * fVar110 - fVar134 * fVar202;
  fVar322 = fVar207 * fVar134 - fVar135 * fVar205;
  fVar324 = fVar202 * fVar135 - fVar110 * fVar207;
  fVar334 = fVar221 * fVar136 - fVar136 * fVar221;
  fVar200 = fVar205 * fVar149 - fVar108 * fVar202;
  fVar201 = fVar207 * fVar108 - fVar109 * fVar205;
  fVar303 = fVar202 * fVar109 - fVar149 * fVar207;
  fVar172 = fVar240 * fVar240 + fVar244 * fVar244 + fVar239 * fVar239;
  auVar71 = ZEXT416((uint)fVar172);
  auVar138 = rsqrtss(ZEXT416((uint)fVar172),auVar71);
  fVar149 = auVar138._0_4_;
  fVar338 = fVar149 * 1.5 - fVar149 * fVar149 * fVar172 * 0.5 * fVar149;
  fVar272 = fVar239 * fVar222 + fVar240 * fVar326 + fVar244 * fVar336;
  fVar266 = fVar245 * fVar338;
  auVar71 = rcpss(auVar71,auVar71);
  fVar283 = (2.0 - fVar172 * auVar71._0_4_) * auVar71._0_4_;
  fVar234 = fVar324 * fVar324 + fVar322 * fVar322 + fVar309 * fVar309;
  auVar138 = ZEXT416((uint)fVar234);
  auVar71 = rsqrtss(ZEXT416((uint)fVar234),auVar138);
  fVar149 = auVar71._0_4_;
  fVar273 = fVar149 * 1.5 - fVar149 * fVar149 * fVar234 * 0.5 * fVar149;
  fVar284 = fVar309 * fVar200 + fVar324 * fVar303 + fVar322 * fVar201;
  lVar19 = *(long *)(_Var16 + 0x38 + lVar59);
  lVar21 = *(long *)(_Var16 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar19 + lVar21 * uVar56);
  fVar149 = *pfVar1;
  fVar108 = pfVar1[1];
  fVar109 = pfVar1[2];
  fVar110 = pfVar1[3];
  pfVar1 = (float *)(lVar19 + lVar21 * lVar61);
  fVar134 = *pfVar1;
  fVar135 = pfVar1[1];
  fVar136 = pfVar1[2];
  fVar148 = pfVar1[3];
  lVar19 = *(long *)(lVar17 + 0x38 + lVar59);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar19 + lVar17 * lVar61);
  fVar150 = *pfVar1;
  fVar159 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar161 = pfVar1[3];
  lVar21 = *(long *)(_Var20 + 0x38 + lVar59);
  lVar22 = *(long *)(_Var20 + 0x48 + lVar59);
  uVar57 = uVar56 * lVar22;
  auVar71 = rcpss(auVar138,auVar138);
  pfVar1 = (float *)(lVar21 + lVar22 * lVar61);
  fVar174 = fVar334 * fVar273;
  fVar285 = (2.0 - fVar234 * auVar71._0_4_) * auVar71._0_4_;
  fVar330 = fVar312 * fVar244 * fVar338;
  fVar335 = fVar312 * fVar240 * fVar338;
  fVar337 = fVar312 * fVar239 * fVar338;
  fVar339 = fVar312 * fVar266;
  fVar307 = fVar238 - fVar330;
  fVar235 = fVar291 - fVar335;
  fVar241 = fVar306 - fVar337;
  fVar246 = fVar312 - fVar339;
  fVar313 = fVar312 * fVar283 * (fVar172 * fVar336 - fVar272 * fVar244) * fVar338 +
            fVar271 * fVar244 * fVar338;
  fVar323 = fVar312 * fVar283 * (fVar172 * fVar326 - fVar272 * fVar240) * fVar338 +
            fVar271 * fVar240 * fVar338;
  fVar325 = fVar312 * fVar283 * (fVar172 * fVar222 - fVar272 * fVar239) * fVar338 +
            fVar271 * fVar239 * fVar338;
  fVar327 = fVar312 * fVar283 * (fVar172 * (fVar271 * fVar329 - fVar329 * fVar271) -
                                fVar272 * fVar245) * fVar338 + fVar271 * fVar266;
  fVar330 = fVar330 + fVar238;
  fVar335 = fVar335 + fVar291;
  fVar337 = fVar337 + fVar306;
  fVar339 = fVar339 + fVar312;
  fVar266 = fVar286 * fVar322 * fVar273;
  fVar222 = fVar286 * fVar324 * fVar273;
  fVar238 = fVar286 * fVar309 * fVar273;
  fVar283 = fVar286 * fVar174;
  pfVar2 = (float *)(*(long *)(p_Var18 + lVar59 + 0x38) +
                    *(long *)(p_Var18 + lVar59 + 0x48) * lVar61);
  fVar250 = fVar206 - fVar266;
  fVar264 = fVar220 - fVar222;
  fVar267 = fVar249 - fVar238;
  fVar269 = fVar286 - fVar283;
  fVar326 = fVar286 * fVar285 * (fVar234 * fVar201 - fVar284 * fVar322) * fVar273 +
            fVar221 * fVar322 * fVar273;
  fVar336 = fVar286 * fVar285 * (fVar234 * fVar303 - fVar284 * fVar324) * fVar273 +
            fVar221 * fVar324 * fVar273;
  fVar239 = fVar286 * fVar285 * (fVar234 * fVar200 - fVar284 * fVar309) * fVar273 +
            fVar221 * fVar309 * fVar273;
  fVar245 = fVar286 * fVar285 * (fVar234 * (fVar221 * fVar173 - fVar173 * fVar221) -
                                fVar284 * fVar334) * fVar273 + fVar221 * fVar174;
  fVar266 = fVar266 + fVar206;
  fVar222 = fVar222 + fVar220;
  fVar238 = fVar238 + fVar249;
  fVar283 = fVar283 + fVar286;
  fVar286 = fVar134 - *pfVar2 * 0.33333334;
  fVar303 = fVar135 - pfVar2[1] * 0.33333334;
  fVar309 = fVar136 - pfVar2[2] * 0.33333334;
  fVar322 = fVar148 - pfVar2[3] * 0.33333334;
  fVar284 = fVar150 - *pfVar1 * 0.33333334;
  fVar287 = fVar159 - pfVar1[1] * 0.33333334;
  fVar289 = fVar160 - pfVar1[2] * 0.33333334;
  fVar292 = fVar161 - pfVar1[3] * 0.33333334;
  fVar201 = fVar286 * 0.0;
  fVar206 = fVar303 * 0.0;
  fVar220 = fVar309 * 0.0;
  fVar249 = fVar322 * 0.0;
  fVar310 = fVar134 * 0.0 + fVar201;
  fVar236 = fVar135 * 0.0 + fVar206;
  fVar242 = fVar136 * 0.0 + fVar220;
  fVar247 = fVar148 * 0.0 + fVar249;
  pfVar1 = (float *)(*(long *)(p_Var18 + lVar59 + 0x38) +
                    *(long *)(p_Var18 + lVar59 + 0x48) * uVar56);
  fVar172 = *pfVar1 * 0.33333334 + fVar149;
  fVar173 = pfVar1[1] * 0.33333334 + fVar108;
  fVar174 = pfVar1[2] * 0.33333334 + fVar109;
  fVar200 = pfVar1[3] * 0.33333334 + fVar110;
  fVar329 = fVar172 * 0.0;
  fVar338 = fVar173 * 0.0;
  fVar240 = fVar174 * 0.0;
  fVar272 = fVar200 * 0.0;
  fVar291 = (fVar172 * 3.0 + fVar310) - fVar149 * 3.0;
  fVar306 = (fVar173 * 3.0 + fVar236) - fVar108 * 3.0;
  fVar312 = (fVar174 * 3.0 + fVar242) - fVar109 * 3.0;
  fVar324 = (fVar200 * 3.0 + fVar247) - fVar110 * 3.0;
  fVar251 = fVar284 * 0.0;
  fVar265 = fVar287 * 0.0;
  fVar268 = fVar289 * 0.0;
  fVar270 = fVar292 * 0.0;
  fVar223 = fVar150 * 0.0 + fVar251;
  fVar237 = fVar159 * 0.0 + fVar265;
  fVar243 = fVar160 * 0.0 + fVar268;
  fVar248 = fVar161 * 0.0 + fVar270;
  pfVar1 = (float *)(lVar21 + uVar57);
  pfVar2 = (float *)(lVar19 + lVar17 * uVar56);
  fVar172 = *pfVar2;
  fVar173 = pfVar2[1];
  fVar174 = pfVar2[2];
  fVar200 = pfVar2[3];
  fVar334 = *pfVar1 * 0.33333334 + fVar172;
  fVar234 = pfVar1[1] * 0.33333334 + fVar173;
  fVar244 = pfVar1[2] * 0.33333334 + fVar174;
  fVar273 = pfVar1[3] * 0.33333334 + fVar200;
  fVar293 = fVar334 * 0.0;
  fVar305 = fVar234 * 0.0;
  fVar308 = fVar244 * 0.0;
  fVar311 = fVar273 * 0.0;
  fVar285 = (fVar334 * 3.0 + fVar223) - fVar172 * 3.0;
  fVar288 = (fVar234 * 3.0 + fVar237) - fVar173 * 3.0;
  fVar290 = (fVar244 * 3.0 + fVar243) - fVar174 * 3.0;
  fVar304 = (fVar273 * 3.0 + fVar248) - fVar200 * 3.0;
  fVar334 = fVar329 + fVar310 + fVar149;
  fVar234 = fVar338 + fVar236 + fVar108;
  fVar244 = fVar240 + fVar242 + fVar109;
  fVar273 = fVar272 + fVar247 + fVar110;
  fVar201 = fVar201 + fVar134 + fVar329 + fVar149 * 0.0;
  fVar206 = fVar206 + fVar135 + fVar338 + fVar108 * 0.0;
  fVar220 = fVar220 + fVar136 + fVar240 + fVar109 * 0.0;
  fVar249 = fVar249 + fVar148 + fVar272 + fVar110 * 0.0;
  fVar149 = ((fVar134 * 3.0 - fVar286 * 3.0) + fVar329) - fVar149 * 0.0;
  fVar108 = ((fVar135 * 3.0 - fVar303 * 3.0) + fVar338) - fVar108 * 0.0;
  fVar109 = ((fVar136 * 3.0 - fVar309 * 3.0) + fVar240) - fVar109 * 0.0;
  fVar110 = ((fVar148 * 3.0 - fVar322 * 3.0) + fVar272) - fVar110 * 0.0;
  fVar148 = fVar293 + fVar223 + fVar172;
  fVar329 = fVar305 + fVar237 + fVar173;
  fVar240 = fVar308 + fVar243 + fVar174;
  fVar310 = fVar311 + fVar248 + fVar200;
  fVar286 = fVar251 + fVar150 + fVar293 + fVar172 * 0.0;
  fVar303 = fVar265 + fVar159 + fVar305 + fVar173 * 0.0;
  fVar322 = fVar268 + fVar160 + fVar308 + fVar174 * 0.0;
  fVar338 = fVar270 + fVar161 + fVar311 + fVar200 * 0.0;
  fVar134 = ((fVar150 * 3.0 - fVar284 * 3.0) + fVar293) - fVar172 * 0.0;
  fVar135 = ((fVar159 * 3.0 - fVar287 * 3.0) + fVar305) - fVar173 * 0.0;
  fVar136 = ((fVar160 * 3.0 - fVar289 * 3.0) + fVar308) - fVar174 * 0.0;
  fVar309 = ((fVar161 * 3.0 - fVar292 * 3.0) + fVar311) - fVar200 * 0.0;
  fVar173 = fVar306 * fVar148 - fVar329 * fVar291;
  fVar174 = fVar312 * fVar329 - fVar240 * fVar306;
  fVar272 = fVar291 * fVar240 - fVar148 * fVar312;
  fVar292 = fVar324 * fVar310 - fVar310 * fVar324;
  fVar148 = fVar306 * fVar285 - fVar288 * fVar291;
  fVar159 = fVar312 * fVar288 - fVar290 * fVar306;
  fVar161 = fVar291 * fVar290 - fVar285 * fVar312;
  fVar329 = fVar108 * fVar286 - fVar303 * fVar149;
  fVar240 = fVar109 * fVar303 - fVar322 * fVar108;
  fVar284 = fVar149 * fVar322 - fVar286 * fVar109;
  fVar287 = fVar110 * fVar338 - fVar338 * fVar110;
  fVar150 = fVar108 * fVar134 - fVar135 * fVar149;
  fVar160 = fVar109 * fVar135 - fVar136 * fVar108;
  fVar172 = fVar149 * fVar136 - fVar134 * fVar109;
  fVar134 = fVar272 * fVar272 + fVar174 * fVar174 + fVar173 * fVar173;
  auVar71 = ZEXT416((uint)fVar134);
  auVar138 = rsqrtss(ZEXT416((uint)fVar134),auVar71);
  fVar135 = auVar138._0_4_;
  fVar338 = fVar135 * 1.5 - fVar135 * fVar135 * fVar134 * 0.5 * fVar135;
  fVar285 = fVar173 * fVar148 + fVar272 * fVar161 + fVar174 * fVar159;
  auVar71 = rcpss(auVar71,auVar71);
  fVar135 = (2.0 - fVar134 * auVar71._0_4_) * auVar71._0_4_;
  fVar136 = fVar292 * fVar338;
  fVar289 = fVar284 * fVar284 + fVar240 * fVar240 + fVar329 * fVar329;
  auVar71 = ZEXT416((uint)fVar289);
  auVar138 = rsqrtss(ZEXT416((uint)fVar289),auVar71);
  fVar200 = auVar138._0_4_;
  fVar310 = fVar200 * 1.5 - fVar200 * fVar200 * fVar289 * 0.5 * fVar200;
  fVar223 = fVar329 * fVar150 + fVar284 * fVar172 + fVar240 * fVar160;
  auVar71 = rcpss(auVar71,auVar71);
  fVar236 = (2.0 - fVar289 * auVar71._0_4_) * auVar71._0_4_;
  fVar290 = fVar287 * fVar310;
  fVar200 = fVar273 * fVar174 * fVar338;
  fVar286 = fVar273 * fVar272 * fVar338;
  fVar303 = fVar273 * fVar173 * fVar338;
  fVar322 = fVar273 * fVar136;
  fVar159 = fVar273 * fVar135 * (fVar134 * fVar159 - fVar285 * fVar174) * fVar338 +
            fVar324 * fVar174 * fVar338;
  fVar161 = fVar273 * fVar135 * (fVar134 * fVar161 - fVar285 * fVar272) * fVar338 +
            fVar324 * fVar272 * fVar338;
  fVar173 = fVar273 * fVar135 * (fVar134 * fVar148 - fVar285 * fVar173) * fVar338 +
            fVar324 * fVar173 * fVar338;
  fVar174 = fVar273 * fVar135 * (fVar134 * (fVar324 * fVar304 - fVar304 * fVar324) -
                                fVar285 * fVar292) * fVar338 + fVar324 * fVar136;
  fVar338 = fVar334 - fVar200;
  fVar272 = fVar234 - fVar286;
  fVar285 = fVar244 - fVar303;
  fVar288 = fVar273 - fVar322;
  fVar200 = fVar200 + fVar334;
  fVar286 = fVar286 + fVar234;
  fVar303 = fVar303 + fVar244;
  fVar322 = fVar322 + fVar273;
  fVar134 = fVar249 * fVar240 * fVar310;
  fVar135 = fVar249 * fVar284 * fVar310;
  fVar136 = fVar249 * fVar329 * fVar310;
  fVar148 = fVar249 * fVar290;
  fVar334 = fVar249 * fVar236 * (fVar289 * fVar160 - fVar223 * fVar240) * fVar310 +
            fVar110 * fVar240 * fVar310;
  fVar234 = fVar249 * fVar236 * (fVar289 * fVar172 - fVar223 * fVar284) * fVar310 +
            fVar110 * fVar284 * fVar310;
  fVar329 = fVar249 * fVar236 * (fVar289 * fVar150 - fVar223 * fVar329) * fVar310 +
            fVar110 * fVar329 * fVar310;
  fVar240 = fVar249 * fVar236 * (fVar289 * (fVar110 * fVar309 - fVar309 * fVar110) -
                                fVar223 * fVar287) * fVar310 + fVar110 * fVar290;
  fVar150 = fVar201 - fVar134;
  fVar160 = fVar206 - fVar135;
  fVar172 = fVar220 - fVar136;
  fVar309 = fVar249 - fVar148;
  fVar134 = fVar134 + fVar201;
  fVar135 = fVar135 + fVar206;
  fVar136 = fVar136 + fVar220;
  fVar148 = fVar148 + fVar249;
  fVar201 = 1.0 - fVar70;
  local_378 = fVar307 * fVar201 + fVar338 * fVar70;
  fStack_374 = fVar235 * fVar201 + fVar272 * fVar70;
  fStack_370 = fVar241 * fVar201 + fVar285 * fVar70;
  fStack_36c = fVar246 * fVar201 + fVar288 * fVar70;
  local_388 = ((fVar263 - fVar313) * 0.33333334 + fVar307) * fVar201 +
              ((fVar291 - fVar159) * 0.33333334 + fVar338) * fVar70;
  fStack_384 = ((fVar328 - fVar323) * 0.33333334 + fVar235) * fVar201 +
               ((fVar306 - fVar161) * 0.33333334 + fVar272) * fVar70;
  fStack_380 = ((fVar233 - fVar325) * 0.33333334 + fVar241) * fVar201 +
               ((fVar312 - fVar173) * 0.33333334 + fVar285) * fVar70;
  fStack_37c = ((fVar271 - fVar327) * 0.33333334 + fVar246) * fVar201 +
               ((fVar324 - fVar174) * 0.33333334 + fVar288) * fVar70;
  local_3a8 = (fVar250 - (fVar202 - fVar326) * 0.33333334) * fVar201 +
              (fVar150 - (fVar149 - fVar334) * 0.33333334) * fVar70;
  fStack_3a4 = (fVar264 - (fVar205 - fVar336) * 0.33333334) * fVar201 +
               (fVar160 - (fVar108 - fVar234) * 0.33333334) * fVar70;
  fStack_3a0 = (fVar267 - (fVar207 - fVar239) * 0.33333334) * fVar201 +
               (fVar172 - (fVar109 - fVar329) * 0.33333334) * fVar70;
  fStack_39c = (fVar269 - (fVar221 - fVar245) * 0.33333334) * fVar201 +
               (fVar309 - (fVar110 - fVar240) * 0.33333334) * fVar70;
  local_398 = fVar250 * fVar201 + fVar150 * fVar70;
  fStack_394 = fVar264 * fVar201 + fVar160 * fVar70;
  fStack_390 = fVar267 * fVar201 + fVar172 * fVar70;
  fStack_38c = fVar269 * fVar201 + fVar309 * fVar70;
  local_3c8 = fVar330 * fVar201 + fVar200 * fVar70;
  fStack_3c4 = fVar335 * fVar201 + fVar286 * fVar70;
  fStack_3c0 = fVar337 * fVar201 + fVar303 * fVar70;
  fStack_3bc = fVar339 * fVar201 + fVar322 * fVar70;
  local_368 = ((fVar313 + fVar263) * 0.33333334 + fVar330) * fVar201 +
              ((fVar159 + fVar291) * 0.33333334 + fVar200) * fVar70;
  fStack_364 = ((fVar323 + fVar328) * 0.33333334 + fVar335) * fVar201 +
               ((fVar161 + fVar306) * 0.33333334 + fVar286) * fVar70;
  fStack_360 = ((fVar325 + fVar233) * 0.33333334 + fVar337) * fVar201 +
               ((fVar173 + fVar312) * 0.33333334 + fVar303) * fVar70;
  fStack_35c = ((fVar327 + fVar271) * 0.33333334 + fVar339) * fVar201 +
               ((fVar174 + fVar324) * 0.33333334 + fVar322) * fVar70;
  local_3dc.m128[1] =
       (fVar266 - (fVar326 + fVar202) * 0.33333334) * fVar201 +
       (fVar134 - (fVar334 + fVar149) * 0.33333334) * fVar70;
  local_3dc.m128[2] =
       (fVar222 - (fVar336 + fVar205) * 0.33333334) * fVar201 +
       (fVar135 - (fVar234 + fVar108) * 0.33333334) * fVar70;
  local_3dc.m128[3] =
       (fVar238 - (fVar239 + fVar207) * 0.33333334) * fVar201 +
       (fVar136 - (fVar329 + fVar109) * 0.33333334) * fVar70;
  fStack_3cc = (fVar283 - (fVar245 + fVar221) * 0.33333334) * fVar201 +
               (fVar148 - (fVar240 + fVar110) * 0.33333334) * fVar70;
  local_228 = fVar201 * fVar266 + fVar70 * fVar134;
  fStack_224 = fVar201 * fVar222 + fVar70 * fVar135;
  fStack_220 = fVar201 * fVar238 + fVar70 * fVar136;
  fStack_21c = fVar201 * fVar283 + fVar70 * fVar148;
  fVar149 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar70 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar108 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar109 = (pre->ray_space).vx.field_0.m128[0];
  fVar110 = (pre->ray_space).vx.field_0.m128[1];
  fVar134 = (pre->ray_space).vy.field_0.m128[0];
  fVar135 = (pre->ray_space).vy.field_0.m128[1];
  fVar136 = (pre->ray_space).vz.field_0.m128[0];
  fVar148 = (pre->ray_space).vz.field_0.m128[1];
  fVar160 = (local_378 - fVar149) * fVar109 +
            (fStack_374 - fVar70) * fVar134 + (fStack_370 - fVar108) * fVar136;
  fVar161 = (local_378 - fVar149) * fVar110 +
            (fStack_374 - fVar70) * fVar135 + (fStack_370 - fVar108) * fVar148;
  local_2b8 = CONCAT44(fVar161,fVar160);
  fVar150 = (local_388 - fVar149) * fVar109 +
            (fStack_384 - fVar70) * fVar134 + (fStack_380 - fVar108) * fVar136;
  fVar159 = (local_388 - fVar149) * fVar110 +
            (fStack_384 - fVar70) * fVar135 + (fStack_380 - fVar108) * fVar148;
  local_2c8 = CONCAT44(fVar159,fVar150);
  fVar202 = (local_3a8 - fVar149) * fVar109 +
            (fStack_3a4 - fVar70) * fVar134 + (fStack_3a0 - fVar108) * fVar136;
  fVar205 = (local_3a8 - fVar149) * fVar110 +
            (fStack_3a4 - fVar70) * fVar135 + (fStack_3a0 - fVar108) * fVar148;
  local_2d8 = CONCAT44(fVar205,fVar202);
  fVar200 = (local_398 - fVar149) * fVar109 +
            (fStack_394 - fVar70) * fVar134 + (fStack_390 - fVar108) * fVar136;
  fVar201 = (local_398 - fVar149) * fVar110 +
            (fStack_394 - fVar70) * fVar135 + (fStack_390 - fVar108) * fVar148;
  local_2e8 = CONCAT44(fVar201,fVar200);
  fVar174 = (local_3c8 - fVar149) * fVar109 +
            (fStack_3c4 - fVar70) * fVar134 + (fStack_3c0 - fVar108) * fVar136;
  fStack_2f4 = (local_3c8 - fVar149) * fVar110 +
               (fStack_3c4 - fVar70) * fVar135 + (fStack_3c0 - fVar108) * fVar148;
  fVar172 = (local_368 - fVar149) * fVar109 +
            (fStack_364 - fVar70) * fVar134 + (fStack_360 - fVar108) * fVar136;
  fVar173 = (local_368 - fVar149) * fVar110 +
            (fStack_364 - fVar70) * fVar135 + (fStack_360 - fVar108) * fVar148;
  uVar151 = CONCAT44(fVar173,fVar172);
  afStack_208[0] =
       (local_3dc.m128[1] - fVar149) * fVar109 +
       (local_3dc.m128[2] - fVar70) * fVar134 + (local_3dc.m128[3] - fVar108) * fVar136;
  afStack_208[1] =
       (local_3dc.m128[1] - fVar149) * fVar110 +
       (local_3dc.m128[2] - fVar70) * fVar135 + (local_3dc.m128[3] - fVar108) * fVar148;
  fVar109 = (local_228 - fVar149) * fVar109 +
            (fStack_224 - fVar70) * fVar134 + (fStack_220 - fVar108) * fVar136;
  fVar149 = (local_228 - fVar149) * fVar110 +
            (fStack_224 - fVar70) * fVar135 + (fStack_220 - fVar108) * fVar148;
  local_328 = CONCAT44(fVar149,fVar109);
  register0x00001508 = uVar151;
  local_338 = local_2c8;
  register0x00001408 = local_328;
  local_88 = local_2e8;
  auVar91._8_4_ = fVar174;
  auVar91._0_8_ = local_2b8;
  auVar91._12_4_ = fStack_2f4;
  auVar71 = minps(auVar91,_local_338);
  auVar122._8_4_ = afStack_208[0];
  auVar122._0_8_ = local_2d8;
  auVar122._12_4_ = afStack_208[1];
  auVar138 = minps(auVar122,_local_88);
  auVar71 = minps(auVar71,auVar138);
  auVar123._4_4_ = fVar161;
  auVar123._0_4_ = fVar160;
  auVar123._8_4_ = fVar174;
  auVar123._12_4_ = fStack_2f4;
  auVar138 = maxps(auVar123,_local_338);
  auVar139._4_4_ = fVar205;
  auVar139._0_4_ = fVar202;
  auVar139._8_4_ = afStack_208[0];
  auVar139._12_4_ = afStack_208[1];
  auVar140 = maxps(auVar139,_local_88);
  auVar124 = maxps(auVar138,auVar140);
  auVar23._4_8_ = auVar140._8_8_;
  auVar23._0_4_ = auVar71._4_4_;
  auVar141._0_8_ = auVar23._0_8_ << 0x20;
  auVar141._8_4_ = auVar71._8_4_;
  auVar141._12_4_ = auVar71._12_4_;
  auVar142._8_8_ = auVar71._8_8_;
  auVar142._0_8_ = auVar141._8_8_;
  auVar138 = minps(auVar71,auVar142);
  auVar24._4_8_ = auVar71._8_8_;
  auVar24._0_4_ = auVar124._4_4_;
  auVar143._0_8_ = auVar24._0_8_ << 0x20;
  auVar143._8_4_ = auVar124._8_4_;
  auVar143._12_4_ = auVar124._12_4_;
  auVar144._8_8_ = auVar124._8_8_;
  auVar144._0_8_ = auVar143._8_8_;
  auVar71 = maxps(auVar124,auVar144);
  auVar92._0_8_ = auVar138._0_8_ & 0x7fffffff7fffffff;
  auVar92._8_4_ = auVar138._8_4_ & 0x7fffffff;
  auVar92._12_4_ = auVar138._12_4_ & 0x7fffffff;
  auVar125._0_8_ = auVar71._0_8_ & 0x7fffffff7fffffff;
  auVar125._8_4_ = auVar71._8_4_ & 0x7fffffff;
  auVar125._12_4_ = auVar71._12_4_ & 0x7fffffff;
  auVar71 = maxps(auVar92,auVar125);
  fStack_94 = auVar71._4_4_;
  local_98 = fStack_94;
  if (fStack_94 <= auVar71._0_4_) {
    local_98 = auVar71._0_4_;
  }
  lVar61 = (ulong)uVar63 + 0xf;
  local_98 = local_98 * 9.536743e-07;
  register0x00001488 = local_2b8;
  register0x00001388 = local_2c8;
  register0x000015c8 = local_2d8;
  register0x00001588 = local_2e8;
  register0x00001288 = uVar151;
  local_308 = uVar151;
  register0x00001348 = local_328;
  fStack_90 = fStack_94;
  fStack_8c = fStack_94;
  local_158 = local_98;
  fStack_154 = local_98;
  fStack_150 = local_98;
  fStack_14c = local_98;
  local_168 = -local_98;
  fStack_164 = -local_98;
  fStack_160 = -local_98;
  fStack_15c = -local_98;
  local_3e8 = CONCAT44(fStack_2f4,fVar174);
  local_a8 = fVar150 - fVar160;
  fStack_a4 = fVar159 - fVar161;
  fStack_a0 = fVar172 - fVar174;
  fStack_9c = fVar173 - fStack_2f4;
  local_b8 = fVar202 - fVar150;
  fStack_b4 = fVar205 - fVar159;
  fStack_b0 = afStack_208[0] - fVar172;
  fStack_ac = afStack_208[1] - fVar173;
  local_218 = local_2d8;
  local_c8 = fVar200 - fVar202;
  fStack_c4 = fVar201 - fVar205;
  fStack_c0 = fVar109 - afStack_208[0];
  fStack_bc = fVar149 - afStack_208[1];
  local_188 = local_3c8 - local_378;
  fStack_184 = fStack_3c4 - fStack_374;
  fStack_180 = fStack_3c0 - fStack_370;
  fStack_17c = fStack_3bc - fStack_36c;
  local_198 = local_368 - local_388;
  fStack_194 = fStack_364 - fStack_384;
  fStack_190 = fStack_360 - fStack_380;
  fStack_18c = fStack_35c - fStack_37c;
  local_1a8 = local_3dc.m128[1] - local_3a8;
  fStack_1a4 = local_3dc.m128[2] - fStack_3a4;
  fStack_1a0 = local_3dc.m128[3] - fStack_3a0;
  fStack_19c = fStack_3cc - fStack_39c;
  local_1b8 = local_228 - local_398;
  fStack_1b4 = fStack_224 - fStack_394;
  fStack_1b0 = fStack_220 - fStack_390;
  fStack_1ac = fStack_21c - fStack_38c;
  uVar56 = 0;
  fVar149 = 0.0;
  fVar70 = 1.0;
  fVar108 = 0.0;
  fVar109 = 1.0;
  fStack_3b0 = 0.0;
  fStack_3ac = 0.0;
  local_2f8 = fVar174;
  fStack_2f0 = fVar174;
  fStack_2ec = fStack_2f4;
  local_318 = afStack_208[0];
  fStack_314 = afStack_208[1];
  fStack_310 = afStack_208[0];
  fStack_30c = afStack_208[1];
LAB_00b2e316:
  do {
    fVar110 = 1.0 - fVar149;
    fVar134 = 1.0 - fVar149;
    fVar135 = 1.0 - fVar70;
    fVar136 = 1.0 - fVar70;
    fVar220 = local_2b8._0_4_ * fVar110 + local_2f8 * fVar149;
    fVar222 = local_2b8._4_4_ * fVar134 + fStack_2f4 * fVar149;
    fVar233 = local_2b8._8_4_ * fVar135 + fStack_2f0 * fVar70;
    fVar283 = local_2b8._12_4_ * fVar136 + fStack_2ec * fVar70;
    fVar159 = local_2c8._0_4_ * fVar110 + local_308._0_4_ * fVar149;
    fVar263 = local_2c8._4_4_ * fVar134 + local_308._4_4_ * fVar149;
    fVar266 = local_2c8._8_4_ * fVar135 + local_308._8_4_ * fVar70;
    fVar328 = local_2c8._12_4_ * fVar136 + local_308._12_4_ * fVar70;
    fVar322 = local_2d8._0_4_ * fVar110 + local_318 * fVar149;
    fVar324 = local_2d8._4_4_ * fVar134 + fStack_314 * fVar149;
    fVar326 = local_2d8._8_4_ * fVar135 + fStack_310 * fVar70;
    fVar329 = local_2d8._12_4_ * fVar136 + fStack_30c * fVar70;
    fVar238 = fVar110 * local_2e8._0_4_ + fVar149 * local_328._0_4_;
    fVar271 = fVar134 * local_2e8._4_4_ + fVar149 * local_328._4_4_;
    fVar286 = fVar135 * local_2e8._8_4_ + fVar70 * local_328._8_4_;
    fVar291 = fVar136 * local_2e8._12_4_ + fVar70 * local_328._12_4_;
    fVar303 = (fVar109 - fVar108) * 0.11111111;
    local_3b8 = CONCAT44(fVar109,fVar108);
    fVar306 = (fVar109 - fVar108) * 0.0 + fVar108;
    fVar309 = (fVar109 - fVar108) * 0.33333334 + fVar108;
    fVar312 = (fVar109 - fVar108) * 0.6666667 + fVar108;
    fVar108 = (fVar109 - fVar108) * 1.0 + fVar108;
    fVar109 = 1.0 - fVar306;
    fVar110 = 1.0 - fVar309;
    fVar134 = 1.0 - fVar312;
    fVar150 = 1.0 - fVar108;
    fVar172 = fVar159 * fVar109 + fVar322 * fVar306;
    fVar173 = fVar159 * fVar110 + fVar322 * fVar309;
    fVar200 = fVar159 * fVar134 + fVar322 * fVar312;
    fVar201 = fVar159 * fVar150 + fVar322 * fVar108;
    fVar202 = fVar263 * fVar109 + fVar324 * fVar306;
    fVar205 = fVar263 * fVar110 + fVar324 * fVar309;
    fVar206 = fVar263 * fVar134 + fVar324 * fVar312;
    fVar207 = fVar263 * fVar150 + fVar324 * fVar108;
    fVar135 = (fVar220 * fVar109 + fVar159 * fVar306) * fVar109 + fVar306 * fVar172;
    fVar136 = (fVar220 * fVar110 + fVar159 * fVar309) * fVar110 + fVar309 * fVar173;
    fVar148 = (fVar220 * fVar134 + fVar159 * fVar312) * fVar134 + fVar312 * fVar200;
    fVar159 = (fVar220 * fVar150 + fVar159 * fVar108) * fVar150 + fVar108 * fVar201;
    fVar220 = (fVar222 * fVar109 + fVar263 * fVar306) * fVar109 + fVar306 * fVar202;
    fVar221 = (fVar222 * fVar110 + fVar263 * fVar309) * fVar110 + fVar309 * fVar205;
    fVar249 = (fVar222 * fVar134 + fVar263 * fVar312) * fVar134 + fVar312 * fVar206;
    fVar263 = (fVar222 * fVar150 + fVar263 * fVar108) * fVar150 + fVar108 * fVar207;
    fVar172 = fVar172 * fVar109 + (fVar322 * fVar109 + fVar238 * fVar306) * fVar306;
    fVar173 = fVar173 * fVar110 + (fVar322 * fVar110 + fVar238 * fVar309) * fVar309;
    fVar200 = fVar200 * fVar134 + (fVar322 * fVar134 + fVar238 * fVar312) * fVar312;
    fVar201 = fVar201 * fVar150 + (fVar322 * fVar150 + fVar238 * fVar108) * fVar108;
    fVar202 = fVar202 * fVar109 + (fVar324 * fVar109 + fVar271 * fVar306) * fVar306;
    fVar205 = fVar205 * fVar110 + (fVar324 * fVar110 + fVar271 * fVar309) * fVar309;
    fVar206 = fVar206 * fVar134 + (fVar324 * fVar134 + fVar271 * fVar312) * fVar312;
    fVar207 = fVar207 * fVar150 + (fVar324 * fVar150 + fVar271 * fVar108) * fVar108;
    local_268 = fVar109 * fVar135 + fVar306 * fVar172;
    fStack_264 = fVar110 * fVar136 + fVar309 * fVar173;
    fStack_260 = fVar134 * fVar148 + fVar312 * fVar200;
    fStack_25c = fVar150 * fVar159 + fVar108 * fVar201;
    local_148 = fVar109 * fVar220 + fVar306 * fVar202;
    fStack_144 = fVar110 * fVar221 + fVar309 * fVar205;
    fStack_140 = fVar134 * fVar249 + fVar312 * fVar206;
    fStack_13c = fVar150 * fVar263 + fVar108 * fVar207;
    fVar136 = (fVar173 - fVar136) * 3.0 * fVar303;
    fVar148 = (fVar200 - fVar148) * 3.0 * fVar303;
    fVar159 = (fVar201 - fVar159) * 3.0 * fVar303;
    fVar173 = (fVar205 - fVar221) * 3.0 * fVar303;
    fVar200 = (fVar206 - fVar249) * 3.0 * fVar303;
    fVar201 = (fVar207 - fVar263) * 3.0 * fVar303;
    local_238._4_4_ = fStack_260;
    local_238._0_4_ = fStack_264;
    local_238._8_4_ = fStack_25c;
    local_238._12_4_ = 0;
    local_e8._4_4_ = fStack_140;
    local_e8._0_4_ = fStack_144;
    local_248 = local_268 + (fVar172 - fVar135) * 3.0 * fVar303;
    fStack_244 = fStack_264 + fVar136;
    fStack_240 = fStack_260 + fVar148;
    fStack_23c = fStack_25c + fVar159;
    local_358._0_4_ = local_148 + (fVar202 - fVar220) * 3.0 * fVar303;
    local_358._4_4_ = fStack_144 + fVar173;
    fStack_350 = fStack_140 + fVar200;
    fStack_34c = fStack_13c + fVar201;
    local_258._0_4_ = fStack_264 - fVar136;
    local_258._4_4_ = fStack_260 - fVar148;
    local_258._8_4_ = fStack_25c - fVar159;
    local_258._12_4_ = 0;
    auVar93._0_4_ = fStack_144 - fVar173;
    auVar93._4_4_ = fStack_140 - fVar200;
    auVar93._8_4_ = fStack_13c - fVar201;
    auVar93._12_4_ = 0;
    fVar135 = fVar266 * fVar109 + fVar326 * fVar306;
    fVar136 = fVar266 * fVar110 + fVar326 * fVar309;
    fVar148 = fVar266 * fVar134 + fVar326 * fVar312;
    fVar159 = fVar266 * fVar150 + fVar326 * fVar108;
    fVar172 = fVar328 * fVar109 + fVar329 * fVar306;
    fVar173 = fVar328 * fVar110 + fVar329 * fVar309;
    fVar200 = fVar328 * fVar134 + fVar329 * fVar312;
    fVar222 = fVar328 * fVar150 + fVar329 * fVar108;
    fVar201 = (fVar233 * fVar109 + fVar266 * fVar306) * fVar109 + fVar306 * fVar135;
    fVar202 = (fVar233 * fVar110 + fVar266 * fVar309) * fVar110 + fVar309 * fVar136;
    fVar205 = (fVar233 * fVar134 + fVar266 * fVar312) * fVar134 + fVar312 * fVar148;
    fVar206 = (fVar233 * fVar150 + fVar266 * fVar108) * fVar150 + fVar108 * fVar159;
    fVar233 = (fVar283 * fVar109 + fVar328 * fVar306) * fVar109 + fVar306 * fVar172;
    fVar238 = (fVar283 * fVar110 + fVar328 * fVar309) * fVar110 + fVar309 * fVar173;
    fVar271 = (fVar283 * fVar134 + fVar328 * fVar312) * fVar134 + fVar312 * fVar200;
    fVar283 = (fVar283 * fVar150 + fVar328 * fVar108) * fVar150 + fVar108 * fVar222;
    fVar207 = fVar135 * fVar109 + (fVar326 * fVar109 + fVar286 * fVar306) * fVar306;
    fVar220 = fVar136 * fVar110 + (fVar326 * fVar110 + fVar286 * fVar309) * fVar309;
    fVar221 = fVar148 * fVar134 + (fVar326 * fVar134 + fVar286 * fVar312) * fVar312;
    fVar249 = fVar159 * fVar150 + (fVar326 * fVar150 + fVar286 * fVar108) * fVar108;
    fVar263 = fVar172 * fVar109 + (fVar329 * fVar109 + fVar291 * fVar306) * fVar306;
    fVar266 = fVar173 * fVar110 + (fVar329 * fVar110 + fVar291 * fVar309) * fVar309;
    fVar328 = fVar200 * fVar134 + (fVar329 * fVar134 + fVar291 * fVar312) * fVar312;
    fVar222 = fVar222 * fVar150 + (fVar329 * fVar150 + fVar291 * fVar108) * fVar108;
    fVar159 = fVar109 * fVar201 + fVar306 * fVar207;
    fVar172 = fVar110 * fVar202 + fVar309 * fVar220;
    fVar173 = fVar134 * fVar205 + fVar312 * fVar221;
    fVar200 = fVar150 * fVar206 + fVar108 * fVar249;
    fVar135 = fVar109 * fVar233 + fVar306 * fVar263;
    fVar136 = fVar110 * fVar238 + fVar309 * fVar266;
    fVar148 = fVar134 * fVar271 + fVar312 * fVar328;
    fVar150 = fVar150 * fVar283 + fVar108 * fVar222;
    fVar108 = (fVar220 - fVar202) * 3.0 * fVar303;
    fVar109 = (fVar221 - fVar205) * 3.0 * fVar303;
    fVar110 = (fVar249 - fVar206) * 3.0 * fVar303;
    fVar134 = (fVar266 - fVar238) * 3.0 * fVar303;
    fVar202 = (fVar328 - fVar271) * 3.0 * fVar303;
    fVar205 = (fVar222 - fVar283) * 3.0 * fVar303;
    local_f8._4_4_ = fVar173;
    local_f8._0_4_ = fVar172;
    local_f8._8_4_ = fVar200;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar148;
    local_118._0_4_ = fVar136;
    local_118._8_4_ = fVar150;
    local_118._12_4_ = 0;
    local_138 = fVar159 + (fVar207 - fVar201) * 3.0 * fVar303;
    fStack_134 = fVar172 + fVar108;
    fStack_130 = fVar173 + fVar109;
    fStack_12c = fVar200 + fVar110;
    local_108 = fVar135 + (fVar263 - fVar233) * 3.0 * fVar303;
    fStack_104 = fVar136 + fVar134;
    fStack_100 = fVar148 + fVar202;
    fStack_fc = fVar150 + fVar205;
    local_d8._0_4_ = fVar172 - fVar108;
    local_d8._4_4_ = fVar173 - fVar109;
    local_d8._8_4_ = fVar200 - fVar110;
    local_d8._12_4_ = 0;
    local_128._0_4_ = fVar136 - fVar134;
    local_128._4_4_ = fVar148 - fVar202;
    local_128._8_4_ = fVar150 - fVar205;
    local_128._12_4_ = 0;
    fVar108 = (fVar172 - fStack_264) + (fVar159 - local_268);
    fVar109 = (fVar173 - fStack_260) + (fVar172 - fStack_264);
    fVar110 = (fVar200 - fStack_25c) + (fVar173 - fStack_260);
    fVar134 = (fVar200 - fStack_25c) + 0.0;
    local_e8._8_4_ = fStack_13c;
    local_e8._12_4_ = 0;
    fVar201 = (fVar136 - fStack_144) + (fVar135 - local_148);
    fVar202 = (fVar148 - fStack_140) + (fVar136 - fStack_144);
    fVar205 = (fVar150 - fStack_13c) + (fVar148 - fStack_140);
    fVar206 = (fVar150 - fStack_13c) + 0.0;
    auVar213._0_8_ =
         CONCAT44(fStack_144 * fVar109 - fStack_264 * fVar202,
                  local_148 * fVar108 - local_268 * fVar201);
    auVar213._8_4_ = fStack_140 * fVar110 - fStack_260 * fVar205;
    auVar213._12_4_ = fStack_13c * fVar134 - fStack_25c * fVar206;
    auVar162._0_4_ = (float)local_358._0_4_ * fVar108 - local_248 * fVar201;
    auVar162._4_4_ = (float)local_358._4_4_ * fVar109 - fStack_244 * fVar202;
    auVar162._8_4_ = fStack_350 * fVar110 - fStack_240 * fVar205;
    auVar162._12_4_ = fStack_34c * fVar134 - fStack_23c * fVar206;
    auVar191._0_8_ =
         CONCAT44(auVar93._4_4_ * fVar109 - fVar202 * local_258._4_4_,
                  auVar93._0_4_ * fVar108 - fVar201 * local_258._0_4_);
    auVar191._8_4_ = auVar93._8_4_ * fVar110 - fVar205 * local_258._8_4_;
    auVar191._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
    auVar319._0_4_ = fVar108 * fStack_144 - fVar201 * fStack_264;
    auVar319._4_4_ = fVar109 * fStack_140 - fVar202 * fStack_260;
    auVar319._8_4_ = fVar110 * fStack_13c - fVar205 * fStack_25c;
    auVar319._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
    auVar256._0_8_ =
         CONCAT44(fVar136 * fVar109 - fVar172 * fVar202,fVar135 * fVar108 - fVar159 * fVar201);
    auVar256._8_4_ = fVar148 * fVar110 - fVar173 * fVar205;
    auVar256._12_4_ = fVar150 * fVar134 - fVar200 * fVar206;
    auVar332._0_4_ = local_108 * fVar108 - local_138 * fVar201;
    auVar332._4_4_ = fStack_104 * fVar109 - fStack_134 * fVar202;
    auVar332._8_4_ = fStack_100 * fVar110 - fStack_130 * fVar205;
    auVar332._12_4_ = fStack_fc * fVar134 - fStack_12c * fVar206;
    auVar224._0_8_ =
         CONCAT44(local_128._4_4_ * fVar109 - fVar202 * local_d8._4_4_,
                  local_128._0_4_ * fVar108 - fVar201 * local_d8._0_4_);
    auVar224._8_4_ = local_128._8_4_ * fVar110 - fVar205 * local_d8._8_4_;
    auVar224._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
    auVar94._0_4_ = fVar108 * fVar136 - fVar201 * fVar172;
    auVar94._4_4_ = fVar109 * fVar148 - fVar202 * fVar173;
    auVar94._8_4_ = fVar110 * fVar150 - fVar205 * fVar200;
    auVar94._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
    auVar126._8_4_ = auVar213._8_4_;
    auVar126._0_8_ = auVar213._0_8_;
    auVar126._12_4_ = auVar213._12_4_;
    auVar71 = minps(auVar126,auVar162);
    auVar124 = maxps(auVar213,auVar162);
    auVar163._8_4_ = auVar191._8_4_;
    auVar163._0_8_ = auVar191._0_8_;
    auVar163._12_4_ = auVar191._12_4_;
    auVar138 = minps(auVar163,auVar319);
    auVar71 = minps(auVar71,auVar138);
    auVar138 = maxps(auVar191,auVar319);
    auVar140 = maxps(auVar124,auVar138);
    auVar164._8_4_ = auVar256._8_4_;
    auVar164._0_8_ = auVar256._0_8_;
    auVar164._12_4_ = auVar256._12_4_;
    auVar138 = minps(auVar164,auVar332);
    auVar257 = maxps(auVar256,auVar332);
    auVar192._8_4_ = auVar224._8_4_;
    auVar192._0_8_ = auVar224._0_8_;
    auVar192._12_4_ = auVar224._12_4_;
    auVar124 = minps(auVar192,auVar94);
    auVar138 = minps(auVar138,auVar124);
    auVar71 = minps(auVar71,auVar138);
    auVar138 = maxps(auVar224,auVar94);
    auVar138 = maxps(auVar257,auVar138);
    auVar138 = maxps(auVar140,auVar138);
    auVar214._0_4_ =
         -(uint)(local_168 <= auVar138._0_4_ && auVar71._0_4_ <= local_158) & local_178._0_4_;
    auVar214._4_4_ =
         -(uint)(fStack_164 <= auVar138._4_4_ && auVar71._4_4_ <= fStack_154) & local_178._4_4_;
    auVar214._8_4_ =
         -(uint)(fStack_160 <= auVar138._8_4_ && auVar71._8_4_ <= fStack_150) & local_178._8_4_;
    auVar214._12_4_ =
         -(uint)(fStack_15c <= auVar138._12_4_ && auVar71._12_4_ <= fStack_14c) & local_178._12_4_;
    uVar65 = movmskps((int)uVar57,auVar214);
    paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
    if (uVar65 != 0) {
      fVar108 = (fVar172 - fVar159) + (fStack_264 - local_268);
      fVar109 = (fVar173 - fVar172) + (fStack_260 - fStack_264);
      fVar110 = (fVar200 - fVar173) + (fStack_25c - fStack_260);
      fVar134 = (0.0 - fVar200) + (0.0 - fStack_25c);
      fVar201 = (fVar136 - fVar135) + (fStack_144 - local_148);
      fVar202 = (fVar148 - fVar136) + (fStack_140 - fStack_144);
      fVar205 = (fVar150 - fVar148) + (fStack_13c - fStack_140);
      fVar206 = (0.0 - fVar150) + (0.0 - fStack_13c);
      auVar340._0_8_ =
           CONCAT44(fStack_144 * fVar109 - fStack_264 * fVar202,
                    local_148 * fVar108 - local_268 * fVar201);
      auVar340._8_4_ = fStack_140 * fVar110 - fStack_260 * fVar205;
      auVar340._12_4_ = fStack_13c * fVar134 - fStack_25c * fVar206;
      auVar165._0_4_ = (float)local_358._0_4_ * fVar108 - local_248 * fVar201;
      auVar165._4_4_ = (float)local_358._4_4_ * fVar109 - fStack_244 * fVar202;
      auVar165._8_4_ = fStack_350 * fVar110 - fStack_240 * fVar205;
      auVar165._12_4_ = fStack_34c * fVar134 - fStack_23c * fVar206;
      auVar225._0_8_ =
           CONCAT44(auVar93._4_4_ * fVar109 - local_258._4_4_ * fVar202,
                    auVar93._0_4_ * fVar108 - local_258._0_4_ * fVar201);
      auVar225._8_4_ = auVar93._8_4_ * fVar110 - local_258._8_4_ * fVar205;
      auVar225._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
      auVar193._0_4_ = fStack_144 * fVar108 - fStack_264 * fVar201;
      auVar193._4_4_ = fStack_140 * fVar109 - fStack_260 * fVar202;
      auVar193._8_4_ = fStack_13c * fVar110 - fStack_25c * fVar205;
      auVar193._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
      auVar145._0_8_ =
           CONCAT44(fVar136 * fVar109 - fVar172 * fVar202,fVar135 * fVar108 - fVar159 * fVar201);
      auVar145._8_4_ = fVar148 * fVar110 - fVar173 * fVar205;
      auVar145._12_4_ = fVar150 * fVar134 - fVar200 * fVar206;
      auVar278._0_4_ = local_108 * fVar108 - local_138 * fVar201;
      auVar278._4_4_ = fStack_104 * fVar109 - fStack_134 * fVar202;
      auVar278._8_4_ = fStack_100 * fVar110 - fStack_130 * fVar205;
      auVar278._12_4_ = fStack_fc * fVar134 - fStack_12c * fVar206;
      auVar320._0_8_ =
           CONCAT44(local_128._4_4_ * fVar109 - local_d8._4_4_ * fVar202,
                    local_128._0_4_ * fVar108 - local_d8._0_4_ * fVar201);
      auVar320._8_4_ = local_128._8_4_ * fVar110 - local_d8._8_4_ * fVar205;
      auVar320._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
      auVar95._0_4_ = fVar108 * fVar136 - fVar201 * fVar172;
      auVar95._4_4_ = fVar109 * fVar148 - fVar202 * fVar173;
      auVar95._8_4_ = fVar110 * fVar150 - fVar205 * fVar200;
      auVar95._12_4_ = fVar134 * 0.0 - fVar206 * 0.0;
      auVar127._8_4_ = auVar340._8_4_;
      auVar127._0_8_ = auVar340._0_8_;
      auVar127._12_4_ = auVar340._12_4_;
      auVar71 = minps(auVar127,auVar165);
      auVar124 = maxps(auVar340,auVar165);
      auVar166._8_4_ = auVar225._8_4_;
      auVar166._0_8_ = auVar225._0_8_;
      auVar166._12_4_ = auVar225._12_4_;
      auVar138 = minps(auVar166,auVar193);
      auVar71 = minps(auVar71,auVar138);
      auVar138 = maxps(auVar225,auVar193);
      auVar257 = maxps(auVar124,auVar138);
      auVar167._8_4_ = auVar145._8_4_;
      auVar167._0_8_ = auVar145._0_8_;
      auVar167._12_4_ = auVar145._12_4_;
      auVar124 = minps(auVar167,auVar278);
      auVar138 = maxps(auVar145,auVar278);
      auVar194._8_4_ = auVar320._8_4_;
      auVar194._0_8_ = auVar320._0_8_;
      auVar194._12_4_ = auVar320._12_4_;
      auVar140 = minps(auVar194,auVar95);
      auVar124 = minps(auVar124,auVar140);
      auVar71 = minps(auVar71,auVar124);
      auVar124 = maxps(auVar320,auVar95);
      auVar138 = maxps(auVar138,auVar124);
      auVar138 = maxps(auVar257,auVar138);
      auVar341._0_4_ =
           -(uint)(local_168 <= auVar138._0_4_ && auVar71._0_4_ <= local_158) & auVar214._0_4_;
      auVar341._4_4_ =
           -(uint)(fStack_164 <= auVar138._4_4_ && auVar71._4_4_ <= fStack_154) & auVar214._4_4_;
      auVar341._8_4_ =
           -(uint)(fStack_160 <= auVar138._8_4_ && auVar71._8_4_ <= fStack_150) & auVar214._8_4_;
      auVar341._12_4_ =
           -(uint)(fStack_15c <= auVar138._12_4_ && auVar71._12_4_ <= fStack_14c) & auVar214._12_4_;
      uVar65 = movmskps(uVar65,auVar341);
      paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
      auVar332 = local_118;
      if (uVar65 != 0) {
        paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar65;
        afStack_208[uVar56] = (float)(uVar65 & 0xff);
        *(long *)(afStack_78 + uVar56 * 2) = local_3b8;
        *(ulong *)(afStack_58 + uVar56 * 2) = CONCAT44(fVar70,fVar149);
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
LAB_00b2e983:
    _local_418 = auVar93;
    auVar71 = _local_418;
    if ((int)uVar56 == 0) {
      fVar149 = (ray->super_RayK<1>).tfar;
      auVar133._4_4_ = -(uint)(fStack_1c4 <= fVar149);
      auVar133._0_4_ = -(uint)(local_1c8 <= fVar149);
      auVar133._8_4_ = -(uint)(fStack_1c0 <= fVar149);
      auVar133._12_4_ = -(uint)(fStack_1bc <= fVar149);
      uVar65 = movmskps((int)paVar58,auVar133);
      uVar63 = uVar63 & (uint)lVar61 & uVar65;
      if (uVar63 == 0) {
        return;
      }
      goto LAB_00b2d5ea;
    }
    uVar65 = (int)uVar56 - 1;
    uVar57 = (ulong)uVar65;
    fVar108 = afStack_208[uVar57];
    fVar149 = afStack_58[uVar57 * 2];
    fVar70 = afStack_58[uVar57 * 2 + 1];
    uVar5 = 0;
    if (fVar108 != 0.0) {
      for (; ((uint)fVar108 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    fVar108 = (float)((int)fVar108 - 1U & (uint)fVar108);
    afStack_208[uVar57] = fVar108;
    if (fVar108 == 0.0) {
      uVar56 = (ulong)uVar65;
    }
    fVar109 = (float)(uVar5 + 1) * 0.33333334;
    fVar110 = afStack_78[uVar57 * 2];
    fVar134 = afStack_78[uVar57 * 2 + 1];
    fVar108 = fVar110 * (1.0 - (float)uVar5 * 0.33333334) + fVar134 * (float)uVar5 * 0.33333334;
    fVar109 = fVar110 * (1.0 - fVar109) + fVar134 * fVar109;
    fStack_3b0 = fVar110 * 0.0 + fVar134 * 0.0;
    fStack_3ac = fVar110 * 0.0 + fVar134 * 0.0;
    fVar110 = fVar109 - fVar108;
    if (fVar110 < 0.16666667) {
      fVar200 = 1.0 - fVar149;
      fVar201 = 1.0 - fVar149;
      fVar205 = 1.0 - fVar70;
      fVar206 = 1.0 - fVar70;
      fVar136 = (float)local_2b8._0_4_ * fVar200 + local_2f8 * fVar149;
      fVar150 = (float)local_2b8._4_4_ * fVar201 + fStack_2f4 * fVar149;
      fVar172 = fStack_2b0 * fVar205 + fStack_2f0 * fVar70;
      fVar173 = fStack_2ac * fVar206 + fStack_2ec * fVar70;
      fVar134 = (float)local_2c8._0_4_ * fVar200 + (float)local_308._0_4_ * fVar149;
      fVar135 = (float)local_2c8._4_4_ * fVar201 + (float)local_308._4_4_ * fVar149;
      fVar148 = fStack_2c0 * fVar205 + fStack_300 * fVar70;
      fVar159 = fStack_2bc * fVar206 + fStack_2fc * fVar70;
      fVar220 = (float)local_2d8._0_4_ * fVar200 + local_318 * fVar149;
      fVar249 = (float)local_2d8._4_4_ * fVar201 + fStack_314 * fVar149;
      fVar266 = fStack_2d0 * fVar205 + fStack_310 * fVar70;
      fVar222 = fStack_2cc * fVar206 + fStack_30c * fVar70;
      local_3b8 = CONCAT44(fVar109,fVar108);
      fVar202 = (fVar200 * (float)local_2e8._0_4_ + fVar149 * (float)local_328._0_4_) - fVar220;
      fVar149 = (fVar201 * (float)local_2e8._4_4_ + fVar149 * (float)local_328._4_4_) - fVar249;
      fVar205 = (fVar205 * fStack_2e0 + fVar70 * fStack_320) - fVar266;
      fVar206 = (fVar206 * fStack_2dc + fVar70 * fStack_31c) - fVar222;
      fVar70 = fVar108 * (fVar220 - fVar134) + fVar134;
      fVar200 = fVar108 * (fVar249 - fVar135) + fVar135;
      fVar201 = fVar108 * (fVar266 - fVar148) + fVar148;
      fVar207 = fVar108 * (fVar222 - fVar159) + fVar159;
      fVar221 = (fVar220 - fVar134) * fVar109 + fVar134;
      fVar263 = (fVar249 - fVar135) * fVar109 + fVar135;
      fVar328 = (fVar266 - fVar148) * fVar109 + fVar148;
      fVar233 = (fVar222 - fVar159) * fVar109 + fVar159;
      fVar238 = fVar108 * (fVar134 - fVar136) + fVar136;
      fVar271 = fVar108 * (fVar135 - fVar150) + fVar150;
      fVar283 = fVar108 * (fVar148 - fVar172) + fVar172;
      fVar286 = fVar108 * (fVar159 - fVar173) + fVar173;
      auVar226._0_4_ = (fVar70 - fVar238) * fVar108 + fVar238;
      auVar226._4_4_ = (fVar200 - fVar271) * fVar108 + fVar271;
      auVar226._8_4_ = (fVar201 - fVar283) * fVar108 + fVar283;
      auVar226._12_4_ = (fVar207 - fVar286) * fVar108 + fVar286;
      fVar70 = (((fVar108 * fVar202 + fVar220) - fVar70) * fVar108 + fVar70) - auVar226._0_4_;
      fVar200 = (((fVar108 * fVar149 + fVar249) - fVar200) * fVar108 + fVar200) - auVar226._4_4_;
      fVar201 = (((fVar108 * fVar205 + fVar266) - fVar201) * fVar108 + fVar201) - auVar226._8_4_;
      fVar207 = (((fVar108 * fVar206 + fVar222) - fVar207) * fVar108 + fVar207) - auVar226._12_4_;
      auVar146._0_4_ = fVar108 * fVar70 + auVar226._0_4_;
      auVar146._4_4_ = fVar108 * fVar200 + auVar226._4_4_;
      auVar146._8_4_ = fVar108 * fVar201 + auVar226._8_4_;
      auVar146._12_4_ = fVar108 * fVar207 + auVar226._12_4_;
      fVar136 = (fVar134 - fVar136) * fVar109 + fVar136;
      fVar150 = (fVar135 - fVar150) * fVar109 + fVar150;
      fVar172 = (fVar148 - fVar172) * fVar109 + fVar172;
      fVar173 = (fVar159 - fVar173) * fVar109 + fVar173;
      fVar136 = (fVar221 - fVar136) * fVar109 + fVar136;
      fVar150 = (fVar263 - fVar150) * fVar109 + fVar150;
      fVar172 = (fVar328 - fVar172) * fVar109 + fVar172;
      fVar173 = (fVar233 - fVar173) * fVar109 + fVar173;
      fVar134 = (((fVar202 * fVar109 + fVar220) - fVar221) * fVar109 + fVar221) - fVar136;
      fVar135 = (((fVar149 * fVar109 + fVar249) - fVar263) * fVar109 + fVar263) - fVar150;
      fVar148 = (((fVar205 * fVar109 + fVar266) - fVar328) * fVar109 + fVar328) - fVar172;
      fVar159 = (((fVar206 * fVar109 + fVar222) - fVar233) * fVar109 + fVar233) - fVar173;
      fVar136 = fVar109 * fVar134 + fVar136;
      fVar150 = fVar109 * fVar135 + fVar150;
      fVar172 = fVar109 * fVar148 + fVar172;
      fVar173 = fVar109 * fVar159 + fVar173;
      fVar149 = fVar110 * 0.33333334;
      fVar202 = fVar70 * 3.0 * fVar149 + auVar146._0_4_;
      fVar205 = fVar200 * 3.0 * fVar149 + auVar146._4_4_;
      fVar206 = fVar201 * 3.0 * fVar149 + auVar146._8_4_;
      fVar207 = fVar207 * 3.0 * fVar149 + auVar146._12_4_;
      fVar220 = fVar136 - fVar149 * fVar134 * 3.0;
      fVar221 = fVar150 - fVar149 * fVar135 * 3.0;
      fVar249 = fVar172 - fVar149 * fVar148 * 3.0;
      fVar263 = fVar173 - fVar149 * fVar159 * 3.0;
      auVar25._4_8_ = auVar332._8_8_;
      auVar25._0_4_ = auVar146._4_4_;
      auVar331._0_8_ = auVar25._0_8_ << 0x20;
      auVar331._8_4_ = auVar146._8_4_;
      auVar331._12_4_ = auVar146._12_4_;
      auVar332._8_8_ = auVar146._8_8_;
      auVar332._0_8_ = auVar331._8_8_;
      auVar26._4_8_ = auVar226._8_8_;
      auVar26._0_4_ = fVar150;
      auVar227._0_8_ = auVar26._0_8_ << 0x20;
      auVar227._8_4_ = fVar172;
      auVar227._12_4_ = fVar173;
      fVar148 = (fVar172 - fVar136) + (auVar146._8_4_ - auVar146._0_4_);
      fVar159 = (fVar173 - fVar150) + (auVar146._12_4_ - auVar146._4_4_);
      auVar258._0_4_ = fVar221 * fVar159;
      auVar258._4_4_ = fVar221 * fVar159;
      auVar258._8_4_ = fVar263 * fVar159;
      auVar258._12_4_ = fVar263 * fVar159;
      fVar149 = auVar146._0_4_ * fVar148 + auVar146._4_4_ * fVar159;
      fVar70 = auVar146._8_4_ * fVar148 + auVar146._12_4_ * fVar159;
      fVar200 = fVar202 * fVar148 + fVar205 * fVar159;
      fVar201 = fVar206 * fVar148 + fVar207 * fVar159;
      fVar266 = fVar220 * fVar148 + auVar258._0_4_;
      auVar215._0_8_ = CONCAT44(fVar221 * fVar148 + auVar258._4_4_,fVar266);
      auVar215._8_4_ = fVar249 * fVar148 + auVar258._8_4_;
      auVar215._12_4_ = fVar263 * fVar148 + auVar258._12_4_;
      fVar135 = fVar148 * fVar136 + fVar159 * fVar150;
      fVar328 = fVar148 * fVar172 + fVar159 * fVar173;
      auVar27._4_8_ = auVar258._8_8_;
      auVar27._0_4_ = fVar205 * fVar148 + fVar205 * fVar159;
      auVar259._0_8_ = auVar27._0_8_ << 0x20;
      auVar259._8_4_ = fVar201;
      auVar259._12_4_ = fVar207 * fVar148 + fVar207 * fVar159;
      fVar134 = fVar200;
      if (fVar200 <= fVar149) {
        fVar134 = fVar149;
        fVar149 = fVar200;
      }
      auVar260._8_8_ = auVar259._8_8_;
      auVar260._0_8_ = auVar260._8_8_;
      auVar96._8_4_ = auVar215._8_4_;
      auVar96._0_8_ = auVar215._0_8_;
      auVar96._12_4_ = auVar215._12_4_;
      if (fVar135 <= fVar266) {
        auVar96._0_4_ = fVar135;
      }
      if (auVar96._0_4_ <= fVar149) {
        fVar149 = auVar96._0_4_;
      }
      auVar28._4_8_ = auVar96._8_8_;
      auVar28._0_4_ = fVar148 * fVar150 + fVar159 * fVar150;
      auVar97._0_8_ = auVar28._0_8_ << 0x20;
      auVar97._8_4_ = fVar328;
      auVar97._12_4_ = fVar148 * fVar173 + fVar159 * fVar173;
      if (fVar135 <= fVar266) {
        fVar135 = fVar266;
      }
      auVar98._8_8_ = auVar97._8_8_;
      auVar98._0_8_ = auVar98._8_8_;
      if (fVar135 <= fVar134) {
        fVar135 = fVar134;
      }
      if (fVar201 <= fVar70) {
        auVar260._0_4_ = fVar70;
        fVar70 = fVar201;
      }
      auVar128._8_4_ = auVar215._8_4_;
      auVar128._0_8_ = auVar215._8_8_;
      auVar128._12_4_ = auVar215._12_4_;
      if (fVar328 <= auVar215._8_4_) {
        auVar128._0_4_ = fVar328;
      }
      if (auVar128._0_4_ <= fVar70) {
        fVar70 = auVar128._0_4_;
      }
      if (fVar328 <= auVar215._8_4_) {
        auVar98._0_4_ = auVar215._8_4_;
      }
      if (auVar98._0_4_ <= auVar260._0_4_) {
        auVar98._0_4_ = auVar260._0_4_;
      }
      bVar62 = 3 < (uint)uVar56;
      uVar29 = (undefined3)(uVar65 >> 8);
      fVar134 = auVar98._0_4_;
      if ((0.0001 <= fVar149) || (fVar134 <= -0.0001)) break;
      goto LAB_00b2ece3;
    }
  } while( true );
  if ((fVar70 < 0.0001 && -0.0001 < fVar135) ||
     ((fVar149 < 0.0001 && -0.0001 < fVar135 ||
      (paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar29,bVar62),
      auVar93 = _local_418, fVar70 < 0.0001 && -0.0001 < fVar134)))) {
LAB_00b2ece3:
    _local_358 = auVar332;
    local_418 = (undefined1  [8])auVar227._8_8_;
    auVar93 = _local_418;
    bVar62 = bVar62 || fVar110 < 0.001;
    paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar29,bVar62);
    fVar159 = (float)(~-(uint)(fVar149 < 0.0) & 0x3f800000 | -(uint)(fVar149 < 0.0) & 0xbf800000);
    fVar200 = (float)(~-(uint)(fVar135 < 0.0) & 0x3f800000 | -(uint)(fVar135 < 0.0) & 0xbf800000);
    fVar148 = 0.0;
    if ((fVar159 == fVar200) && (!NAN(fVar159) && !NAN(fVar200))) {
      fVar148 = INFINITY;
    }
    fVar201 = 0.0;
    if ((fVar159 == fVar200) && (!NAN(fVar159) && !NAN(fVar200))) {
      fVar201 = -INFINITY;
    }
    fVar266 = (float)(~-(uint)(fVar70 < 0.0) & 0x3f800000 | -(uint)(fVar70 < 0.0) & 0xbf800000);
    if ((fVar159 != fVar266) || (fVar328 = fVar201, NAN(fVar159) || NAN(fVar266))) {
      if ((fVar70 != fVar149) || (NAN(fVar70) || NAN(fVar149))) {
        fVar70 = -fVar149 / (fVar70 - fVar149);
        fVar70 = (1.0 - fVar70) * 0.0 + fVar70;
        fVar328 = fVar70;
      }
      else {
        fVar70 = 0.0;
        if ((fVar149 != 0.0) || (fVar328 = 1.0, NAN(fVar149))) {
          fVar70 = INFINITY;
          fVar328 = -INFINITY;
        }
      }
      if (fVar70 <= fVar148) {
        fVar148 = fVar70;
      }
      if (fVar328 <= fVar201) {
        fVar328 = fVar201;
      }
    }
    fVar149 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar134 < 0.0) * 4);
    if ((fVar200 != fVar149) || (fVar70 = fVar328, NAN(fVar200) || NAN(fVar149))) {
      if ((fVar134 != fVar135) || (NAN(fVar134) || NAN(fVar135))) {
        fVar159 = -fVar135 / (fVar134 - fVar135);
        fVar159 = (1.0 - fVar159) * 0.0 + fVar159;
        fVar70 = fVar159;
      }
      else {
        fVar159 = 0.0;
        if ((fVar135 != 0.0) || (fVar70 = 1.0, NAN(fVar135))) {
          fVar159 = INFINITY;
          fVar70 = -INFINITY;
        }
      }
      if (fVar159 <= fVar148) {
        fVar148 = fVar159;
      }
      if (fVar70 <= fVar328) {
        fVar70 = fVar328;
      }
    }
    if ((fVar266 != fVar149) || (NAN(fVar266) || NAN(fVar149))) {
      fVar148 = (float)(~-(uint)(fVar148 < 1.0) & 0x3f800000 |
                       (uint)fVar148 & -(uint)(fVar148 < 1.0));
      fVar70 = (float)(~-(uint)(fVar70 < 1.0) & (uint)fVar70 | -(uint)(fVar70 < 1.0) & 0x3f800000);
    }
    fStack_410 = auVar71._8_4_;
    fStack_40c = auVar71._12_4_;
    fVar148 = (float)(~-(uint)(fVar148 < 0.0) & (uint)fVar148);
    fVar149 = (float)(~-(uint)(fVar70 < 1.0) & 0x3f800000 | (uint)fVar70 & -(uint)(fVar70 < 1.0));
    auVar332 = _local_358;
    if (fVar148 <= fVar149) {
      fVar148 = fVar148 + -0.1;
      fVar149 = fVar149 + 0.1;
      uVar65 = -(uint)(fVar149 < 1.0);
      fVar148 = (float)(~-(uint)(fVar148 < 0.0) & (uint)fVar148);
      fVar70 = (float)(~uVar65 & 0x3f800000 | (uint)fVar149 & uVar65);
      fVar149 = 1.0 - fVar148;
      fVar222 = 1.0 - fVar148;
      fVar233 = 1.0 - fVar70;
      fVar238 = 1.0 - fVar70;
      fVar135 = auVar146._0_4_ * fVar149 + auVar146._8_4_ * fVar148;
      fVar159 = auVar146._4_4_ * fVar222 + auVar146._12_4_ * fVar148;
      fVar200 = auVar146._0_4_ * fVar233 + auVar146._8_4_ * fVar70;
      fVar201 = auVar146._4_4_ * fVar238 + auVar146._12_4_ * fVar70;
      fVar266 = fVar202 * fVar149 + fVar206 * fVar148;
      fVar328 = fVar205 * fVar222 + fVar207 * fVar148;
      fVar202 = fVar202 * fVar233 + fVar206 * fVar70;
      fVar205 = fVar205 * fVar238 + fVar207 * fVar70;
      fVar206 = fVar220 * fVar149 + fVar249 * fVar148;
      fVar207 = fVar221 * fVar222 + fVar263 * fVar148;
      fVar220 = fVar220 * fVar233 + fVar249 * fVar70;
      fVar221 = fVar221 * fVar238 + fVar263 * fVar70;
      fVar249 = fVar149 * fVar136 + fVar172 * fVar148;
      fVar263 = fVar222 * fVar150 + fVar173 * fVar148;
      fVar136 = fVar233 * fVar136 + fStack_410 * fVar70;
      fVar150 = fVar238 * fVar150 + fStack_40c * fVar70;
      fVar149 = fVar172 * (1.0 - fVar148) + fVar173 * fVar148;
      fVar70 = fVar172 * (1.0 - fVar70) + fVar173 * fVar70;
      fVar110 = 1.0 / fVar110;
      auVar129._0_4_ = fVar136 - fVar249;
      auVar129._4_4_ = fVar150 - fVar263;
      auVar129._8_4_ = fVar136 - fVar136;
      auVar129._12_4_ = fVar150 - fVar150;
      auVar157._0_8_ = CONCAT44(fVar221 - fVar207,fVar220 - fVar206);
      auVar157._8_4_ = fVar220 - fVar220;
      auVar157._12_4_ = fVar221 - fVar221;
      auVar195._0_4_ = fVar202 - fVar266;
      auVar195._4_4_ = fVar205 - fVar328;
      auVar195._8_4_ = fVar202 - fVar202;
      auVar195._12_4_ = fVar205 - fVar205;
      auVar261._0_8_ = CONCAT44((fVar328 - fVar159) * 3.0,(fVar266 - fVar135) * 3.0);
      auVar261._8_4_ = (fVar202 - fVar200) * 3.0;
      auVar261._12_4_ = (fVar205 - fVar201) * 3.0;
      auVar168._0_8_ = CONCAT44((fVar207 - fVar328) * 3.0,(fVar206 - fVar266) * 3.0);
      auVar168._8_4_ = (fVar220 - fVar202) * 3.0;
      auVar168._12_4_ = (fVar221 - fVar205) * 3.0;
      auVar299._0_4_ = (fVar249 - fVar206) * 3.0;
      auVar299._4_4_ = (fVar263 - fVar207) * 3.0;
      auVar299._8_4_ = (fVar136 - fVar220) * 3.0;
      auVar299._12_4_ = (fVar150 - fVar221) * 3.0;
      auVar216._8_4_ = auVar168._8_4_;
      auVar216._0_8_ = auVar168._0_8_;
      auVar216._12_4_ = auVar168._12_4_;
      auVar138 = minps(auVar216,auVar299);
      auVar71 = maxps(auVar168,auVar299);
      auVar279._8_4_ = auVar261._8_4_;
      auVar279._0_8_ = auVar261._0_8_;
      auVar279._12_4_ = auVar261._12_4_;
      auVar140 = minps(auVar279,auVar138);
      auVar124 = maxps(auVar261,auVar71);
      auVar30._4_8_ = auVar71._8_8_;
      auVar30._0_4_ = auVar140._4_4_;
      auVar169._0_8_ = auVar30._0_8_ << 0x20;
      auVar169._8_4_ = auVar140._8_4_;
      auVar169._12_4_ = auVar140._12_4_;
      auVar170._8_8_ = auVar140._8_8_;
      auVar170._0_8_ = auVar169._8_8_;
      auVar31._4_8_ = auVar138._8_8_;
      auVar31._0_4_ = auVar124._4_4_;
      auVar217._0_8_ = auVar31._0_8_ << 0x20;
      auVar217._8_4_ = auVar124._8_4_;
      auVar217._12_4_ = auVar124._12_4_;
      auVar218._8_8_ = auVar124._8_8_;
      auVar218._0_8_ = auVar217._8_8_;
      auVar138 = minps(auVar140,auVar170);
      auVar71 = maxps(auVar124,auVar218);
      fVar291 = auVar138._0_4_ * fVar110;
      fVar303 = auVar138._4_4_ * fVar110;
      fVar306 = auVar138._8_4_ * fVar110;
      fVar309 = auVar138._12_4_ * fVar110;
      fVar221 = fVar110 * auVar71._0_4_;
      fVar263 = fVar110 * auVar71._4_4_;
      fVar328 = fVar110 * auVar71._8_4_;
      fVar110 = fVar110 * auVar71._12_4_;
      fVar283 = 1.0 / (fVar70 - fVar149);
      auVar99._0_8_ = CONCAT44(fVar201 - fVar159,fVar200 - fVar135);
      auVar99._8_4_ = fVar200 - fVar200;
      auVar99._12_4_ = fVar201 - fVar201;
      auVar228._8_4_ = auVar99._8_4_;
      auVar228._0_8_ = auVar99._0_8_;
      auVar228._12_4_ = auVar99._12_4_;
      auVar124 = minps(auVar228,auVar195);
      auVar71 = maxps(auVar99,auVar195);
      auVar147._8_4_ = auVar157._8_4_;
      auVar147._0_8_ = auVar157._0_8_;
      auVar147._12_4_ = auVar157._12_4_;
      auVar138 = minps(auVar147,auVar129);
      auVar124 = minps(auVar124,auVar138);
      auVar138 = maxps(auVar157,auVar129);
      auVar71 = maxps(auVar71,auVar138);
      fVar238 = auVar124._0_4_ * fVar283;
      fVar271 = auVar124._4_4_ * fVar283;
      fVar286 = fVar283 * auVar71._0_4_;
      fVar283 = fVar283 * auVar71._4_4_;
      local_418._4_4_ = fVar149;
      local_418._0_4_ = fVar108;
      fStack_410 = fVar109;
      fStack_40c = fVar70;
      auVar219._4_4_ = fVar70;
      auVar219._0_4_ = fVar109;
      auVar219._8_4_ = fStack_3b0;
      auVar219._12_4_ = fStack_3ac;
      fVar201 = (fVar108 + fVar109) * 0.5;
      fVar202 = (fVar149 + fVar70) * 0.5;
      fVar205 = (fVar109 + fStack_3b0) * 0.0;
      fVar206 = (fVar70 + fStack_3ac) * 0.0;
      fVar135 = local_a8 * fVar201 + fVar160;
      fVar136 = fStack_a4 * fVar201 + fVar161;
      fVar148 = fStack_a0 * fVar201 + 0.0;
      fVar150 = fStack_9c * fVar201 + 0.0;
      fVar159 = local_b8 * fVar201 + (float)local_338._0_4_;
      fVar172 = fStack_b4 * fVar201 + (float)local_338._4_4_;
      fVar173 = fStack_b0 * fVar201 + fStack_330;
      fVar200 = fStack_ac * fVar201 + fStack_32c;
      fVar135 = (fVar159 - fVar135) * fVar201 + fVar135;
      fVar136 = (fVar172 - fVar136) * fVar201 + fVar136;
      fVar148 = (fVar173 - fVar148) * fVar201 + fVar148;
      fVar150 = (fVar200 - fVar150) * fVar201 + fVar150;
      fVar159 = (((local_c8 * fVar201 + (float)local_218) - fVar159) * fVar201 + fVar159) - fVar135;
      fVar172 = (((fStack_c4 * fVar201 + local_218._4_4_) - fVar172) * fVar201 + fVar172) - fVar136;
      fVar173 = (((fStack_c0 * fVar201 + fStack_210) - fVar173) * fVar201 + fVar173) - fVar148;
      fVar200 = (((fStack_bc * fVar201 + fStack_20c) - fVar200) * fVar201 + fVar200) - fVar150;
      fVar135 = fVar201 * fVar159 + fVar135;
      fVar136 = fVar201 * fVar172 + fVar136;
      fVar159 = fVar159 * 3.0;
      fVar172 = fVar172 * 3.0;
      fVar148 = (fVar201 * fVar173 + fVar148) - fVar135;
      fVar150 = (fVar201 * fVar200 + fVar150) - fVar136;
      fVar159 = (fVar173 * 3.0 - fVar159) * fVar202 + fVar159;
      fVar172 = (fVar200 * 3.0 - fVar172) * fVar202 + fVar172;
      auVar158._0_8_ = CONCAT44(fVar159,fVar148) ^ 0x80000000;
      auVar158._8_4_ = fVar159;
      auVar158._12_4_ = fVar159;
      fVar312 = fVar108 - fVar201;
      fVar322 = fVar149 - fVar202;
      fVar324 = fVar109 - fVar205;
      fVar326 = fVar70 - fVar206;
      fVar329 = fVar109 - fVar201;
      fVar334 = fVar70 - fVar202;
      fVar205 = fStack_3b0 - fVar205;
      fVar206 = fStack_3ac - fVar206;
      fVar135 = fVar148 * fVar202 + fVar135;
      fVar136 = fVar150 * fVar202 + fVar136;
      auVar171._0_8_ = CONCAT44(fVar172,fVar150) ^ 0x8000000000000000;
      auVar171._8_4_ = -fVar172;
      auVar171._12_4_ = -fVar172;
      auVar100._0_4_ = fVar150 * fVar159 - fVar172 * fVar148;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar138 = divps(auVar171,auVar100);
      auVar71 = divps(auVar158,auVar100);
      fVar207 = auVar138._0_4_;
      fVar220 = auVar138._4_4_;
      fVar173 = auVar71._0_4_;
      fVar200 = auVar71._4_4_;
      fVar201 = fVar201 - (fVar136 * fVar173 + fVar135 * fVar207);
      fVar159 = fVar202 - (fVar136 * fVar200 + fVar135 * fVar220);
      fVar172 = fVar202 - (fVar136 * auVar71._8_4_ + fVar135 * auVar138._8_4_);
      fVar202 = fVar202 - (fVar136 * auVar71._12_4_ + fVar135 * auVar138._12_4_);
      auVar130._0_8_ = CONCAT44(fVar220 * fVar238,fVar220 * fVar291);
      auVar130._8_4_ = fVar220 * fVar303;
      auVar130._12_4_ = fVar220 * fVar271;
      auVar101._0_4_ = fVar220 * fVar221;
      auVar101._4_4_ = fVar220 * fVar286;
      auVar101._8_4_ = fVar220 * fVar263;
      auVar101._12_4_ = fVar220 * fVar283;
      auVar343._8_4_ = auVar130._8_4_;
      auVar343._0_8_ = auVar130._0_8_;
      auVar343._12_4_ = auVar130._12_4_;
      auVar140 = minps(auVar343,auVar101);
      auVar71 = maxps(auVar101,auVar130);
      auVar196._0_8_ = CONCAT44(fVar200 * fVar271,fVar200 * fVar303);
      auVar196._8_4_ = fVar200 * fVar306;
      auVar196._12_4_ = fVar200 * fVar309;
      auVar131._0_4_ = fVar200 * fVar263;
      auVar131._4_4_ = fVar200 * fVar283;
      auVar131._8_4_ = fVar200 * fVar328;
      auVar131._12_4_ = fVar200 * fVar110;
      auVar280._8_4_ = auVar196._8_4_;
      auVar280._0_8_ = auVar196._0_8_;
      auVar280._12_4_ = auVar196._12_4_;
      auVar124 = minps(auVar280,auVar131);
      auVar138 = maxps(auVar131,auVar196);
      fVar135 = 0.0 - (auVar138._0_4_ + auVar71._0_4_);
      fVar136 = 1.0 - (auVar138._4_4_ + auVar71._4_4_);
      fVar148 = 0.0 - (auVar138._8_4_ + auVar71._8_4_);
      fVar150 = 0.0 - (auVar138._12_4_ + auVar71._12_4_);
      fVar249 = 0.0 - (auVar124._0_4_ + auVar140._0_4_);
      fVar266 = 1.0 - (auVar124._4_4_ + auVar140._4_4_);
      fVar222 = 0.0 - (auVar124._8_4_ + auVar140._8_4_);
      fVar233 = 0.0 - (auVar124._12_4_ + auVar140._12_4_);
      auVar132._0_8_ = CONCAT44(fVar322 * fVar136,fVar312 * fVar135);
      auVar132._8_4_ = fVar324 * fVar148;
      auVar132._12_4_ = fVar326 * fVar150;
      auVar300._0_8_ = CONCAT44(fVar238 * fVar207,fVar291 * fVar207);
      auVar300._8_4_ = fVar303 * fVar207;
      auVar300._12_4_ = fVar271 * fVar207;
      auVar197._0_4_ = fVar207 * fVar221;
      auVar197._4_4_ = fVar207 * fVar286;
      auVar197._8_4_ = fVar207 * fVar263;
      auVar197._12_4_ = fVar207 * fVar283;
      auVar281._8_4_ = auVar300._8_4_;
      auVar281._0_8_ = auVar300._0_8_;
      auVar281._12_4_ = auVar300._12_4_;
      auVar138 = minps(auVar281,auVar197);
      auVar71 = maxps(auVar197,auVar300);
      auVar229._0_8_ = CONCAT44(fVar271 * fVar173,fVar303 * fVar173);
      auVar229._8_4_ = fVar306 * fVar173;
      auVar229._12_4_ = fVar309 * fVar173;
      auVar301._0_4_ = fVar173 * fVar263;
      auVar301._4_4_ = fVar173 * fVar283;
      auVar301._8_4_ = fVar173 * fVar328;
      auVar301._12_4_ = fVar173 * fVar110;
      auVar342._8_4_ = auVar229._8_4_;
      auVar342._0_8_ = auVar229._0_8_;
      auVar342._12_4_ = auVar229._12_4_;
      auVar140 = minps(auVar342,auVar301);
      auVar282._0_4_ = fVar312 * fVar249;
      auVar282._4_4_ = fVar322 * fVar266;
      auVar282._8_4_ = fVar324 * fVar222;
      auVar282._12_4_ = fVar326 * fVar233;
      auVar102._0_8_ = CONCAT44(fVar136 * fVar334,fVar135 * fVar329);
      auVar102._8_4_ = fVar148 * fVar205;
      auVar102._12_4_ = fVar150 * fVar206;
      auVar204._0_4_ = fVar249 * fVar329;
      auVar204._4_4_ = fVar266 * fVar334;
      auVar204._8_4_ = fVar222 * fVar205;
      auVar204._12_4_ = fVar233 * fVar206;
      auVar124 = maxps(auVar301,auVar229);
      fVar110 = 1.0 - (auVar124._0_4_ + auVar71._0_4_);
      fVar135 = 0.0 - (auVar124._4_4_ + auVar71._4_4_);
      fVar136 = 0.0 - (auVar124._8_4_ + auVar71._8_4_);
      fVar148 = 0.0 - (auVar124._12_4_ + auVar71._12_4_);
      fVar150 = 1.0 - (auVar140._0_4_ + auVar138._0_4_);
      fVar221 = 0.0 - (auVar140._4_4_ + auVar138._4_4_);
      fVar249 = 0.0 - (auVar140._8_4_ + auVar138._8_4_);
      fVar263 = 0.0 - (auVar140._12_4_ + auVar138._12_4_);
      auVar230._0_8_ = CONCAT44(fVar322 * fVar135,fVar312 * fVar110);
      auVar230._8_4_ = fVar324 * fVar136;
      auVar230._12_4_ = fVar326 * fVar148;
      auVar321._0_4_ = fVar312 * fVar150;
      auVar321._4_4_ = fVar322 * fVar221;
      auVar321._8_4_ = fVar324 * fVar249;
      auVar321._12_4_ = fVar326 * fVar263;
      auVar198._0_8_ = CONCAT44(fVar135 * fVar334,fVar110 * fVar329);
      auVar198._8_4_ = fVar136 * fVar205;
      auVar198._12_4_ = fVar148 * fVar206;
      auVar262._0_4_ = fVar150 * fVar329;
      auVar262._4_4_ = fVar221 * fVar334;
      auVar262._8_4_ = fVar249 * fVar205;
      auVar262._12_4_ = fVar263 * fVar206;
      auVar302._8_4_ = auVar230._8_4_;
      auVar302._0_8_ = auVar230._0_8_;
      auVar302._12_4_ = auVar230._12_4_;
      auVar71 = minps(auVar302,auVar321);
      auVar333._8_4_ = auVar198._8_4_;
      auVar333._0_8_ = auVar198._0_8_;
      auVar333._12_4_ = auVar198._12_4_;
      auVar138 = minps(auVar333,auVar262);
      auVar257 = minps(auVar71,auVar138);
      auVar138 = maxps(auVar321,auVar230);
      auVar71 = maxps(auVar262,auVar198);
      auVar124 = maxps(auVar71,auVar138);
      auVar231._8_4_ = auVar132._8_4_;
      auVar231._0_8_ = auVar132._0_8_;
      auVar231._12_4_ = auVar132._12_4_;
      auVar138 = minps(auVar231,auVar282);
      auVar199._8_4_ = auVar102._8_4_;
      auVar199._0_8_ = auVar102._0_8_;
      auVar199._12_4_ = auVar102._12_4_;
      auVar71 = minps(auVar199,auVar204);
      auVar138 = minps(auVar138,auVar71);
      auVar140 = maxps(auVar282,auVar132);
      auVar71 = maxps(auVar204,auVar102);
      auVar71 = maxps(auVar71,auVar140);
      auVar232._0_4_ = auVar257._4_4_ + auVar257._0_4_ + fVar201;
      auVar232._4_4_ = auVar138._4_4_ + auVar138._0_4_ + fVar159;
      auVar232._8_4_ = auVar257._8_4_ + auVar257._4_4_ + fVar172;
      auVar232._12_4_ = auVar257._12_4_ + auVar138._4_4_ + fVar202;
      fVar110 = auVar124._4_4_ + auVar124._0_4_ + fVar201;
      fVar135 = auVar71._4_4_ + auVar71._0_4_ + fVar159;
      auVar103._4_4_ = fVar135;
      auVar103._0_4_ = fVar110;
      auVar138 = maxps(_local_418,auVar232);
      auVar103._8_4_ = auVar124._8_4_ + auVar124._4_4_ + fVar172;
      auVar103._12_4_ = auVar124._12_4_ + auVar71._4_4_ + fVar202;
      auVar71 = minps(auVar103,auVar219);
      iVar64 = -(uint)(auVar71._0_4_ < auVar138._0_4_);
      iVar66 = -(uint)(auVar71._4_4_ < auVar138._4_4_);
      auVar105._4_4_ = iVar66;
      auVar105._0_4_ = iVar64;
      auVar105._8_4_ = iVar66;
      auVar105._12_4_ = iVar66;
      auVar104._8_8_ = auVar105._8_8_;
      auVar104._4_4_ = iVar64;
      auVar104._0_4_ = iVar64;
      iVar64 = movmskpd((uint)(fVar134 < 0.0),auVar104);
      auVar332 = _DAT_01f7b6c0;
      auVar93 = _local_418;
      if (iVar64 == 0) {
        bVar54 = 0;
        if ((fVar108 < auVar232._0_4_) && (fVar110 < fVar109)) {
          bVar54 = -(fVar135 < fVar70) & fVar149 < auVar232._4_4_;
        }
        bVar54 = bVar62 | bVar54;
        uVar57 = (ulong)CONCAT31(uVar29,bVar54);
        if (bVar54 != 1) goto LAB_00b2e316;
        paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
        do {
          fVar149 = 1.0 - fVar201;
          fVar110 = fVar201 * fVar201 * fVar201;
          fVar109 = fVar201 * fVar201 * 3.0 * fVar149;
          fVar70 = fVar149 * fVar149 * fVar149;
          fVar134 = fVar201 * 3.0 * fVar149 * fVar149;
          fVar108 = fVar70 * fVar160 +
                    fVar134 * (float)local_338._0_4_ +
                    fVar109 * (float)local_218 + fVar110 * (float)local_88._0_4_;
          fVar149 = fVar70 * fVar161 +
                    fVar134 * (float)local_338._4_4_ +
                    fVar109 * local_218._4_4_ + fVar110 * (float)local_88._4_4_;
          fVar108 = ((fVar70 * 0.0 +
                     fVar134 * fStack_330 + fVar109 * fStack_210 + fVar110 * fStack_80) - fVar108) *
                    fVar159 + fVar108;
          fVar149 = ((fVar70 * 0.0 +
                     fVar134 * fStack_32c + fVar109 * fStack_20c + fVar110 * fStack_7c) - fVar149) *
                    fVar159 + fVar149;
          fVar201 = fVar201 - (fVar149 * fVar173 + fVar108 * fVar207);
          fVar159 = fVar159 - (fVar149 * fVar200 + fVar108 * fVar220);
          fVar108 = (float)((uint)fVar108 & (uint)DAT_01f7b6c0);
          fVar149 = (float)((uint)fVar149 & DAT_01f7b6c0._4_4_);
          if (fVar149 <= fVar108) {
            fVar149 = fVar108;
          }
          if (fVar149 < local_98) {
            auVar332 = _DAT_01f7b6c0;
            if ((((fVar201 < 0.0) || (auVar332 = _DAT_01f7b6c0, 1.0 < fVar201)) ||
                (auVar332 = _DAT_01f7b6c0, fVar159 < 0.0)) ||
               (auVar332 = _DAT_01f7b6c0, 1.0 < fVar159)) break;
            fVar149 = (pre->ray_space).vx.field_0.m128[2];
            fVar70 = (pre->ray_space).vy.field_0.m128[2];
            fVar108 = (pre->ray_space).vz.field_0.m128[2];
            fVar109 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar110 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar134 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar173 = 1.0 - fVar159;
            fVar172 = 1.0 - fVar201;
            fVar135 = fVar172 * fVar172 * fVar172;
            fVar136 = fVar201 * 3.0 * fVar172 * fVar172;
            fVar150 = fVar201 * fVar201 * fVar201;
            fVar148 = fVar201 * fVar201 * 3.0 * fVar172;
            fVar149 = (((fStack_370 - fVar134) * fVar108 +
                       (fStack_374 - fVar110) * fVar70 + (local_378 - fVar109) * fVar149) * fVar173
                      + ((fStack_3c0 - fVar134) * fVar108 +
                        (fStack_3c4 - fVar110) * fVar70 + (local_3c8 - fVar109) * fVar149) * fVar159
                      ) * fVar135 +
                      (((fStack_380 - fVar134) * fVar108 +
                       (fStack_384 - fVar110) * fVar70 + (local_388 - fVar109) * fVar149) * fVar173
                      + ((fStack_360 - fVar134) * fVar108 +
                        (fStack_364 - fVar110) * fVar70 + (local_368 - fVar109) * fVar149) * fVar159
                      ) * fVar136 +
                      (((fStack_3a0 - fVar134) * fVar108 +
                       (fStack_3a4 - fVar110) * fVar70 + (local_3a8 - fVar109) * fVar149) * fVar173
                      + ((local_3dc.m128[3] - fVar134) * fVar108 +
                        (local_3dc.m128[2] - fVar110) * fVar70 +
                        (local_3dc.m128[1] - fVar109) * fVar149) * fVar159) * fVar148 +
                      (fVar173 * ((fStack_390 - fVar134) * fVar108 +
                                 (fStack_394 - fVar110) * fVar70 + (local_398 - fVar109) * fVar149)
                      + ((fStack_220 - fVar134) * fVar108 +
                        (fStack_224 - fVar110) * fVar70 + (local_228 - fVar109) * fVar149) * fVar159
                      ) * fVar150;
            auVar332 = _DAT_01f7b6c0;
            if (fVar149 < (ray->super_RayK<1>).org.field_0.m128[3]) break;
            fVar70 = (ray->super_RayK<1>).tfar;
            auVar332 = ZEXT416((uint)fVar70);
            if (fVar70 < fVar149) break;
            fVar134 = 1.0 - fVar159;
            fVar173 = 1.0 - fVar159;
            fVar200 = 1.0 - fVar159;
            fVar108 = local_388 * fVar134 + local_368 * fVar159;
            fVar109 = fStack_384 * fVar173 + fStack_364 * fVar159;
            fVar110 = fStack_380 * fVar200 + fStack_360 * fVar159;
            fVar202 = local_3a8 * fVar134 + local_3dc.m128[1] * fVar159;
            fVar206 = fStack_3a4 * fVar173 + local_3dc.m128[2] * fVar159;
            fVar220 = fStack_3a0 * fVar200 + local_3dc.m128[3] * fVar159;
            fVar205 = fVar202 - fVar108;
            fVar207 = fVar206 - fVar109;
            fVar221 = fVar220 - fVar110;
            fVar108 = (((fVar108 - (local_378 * fVar134 + local_3c8 * fVar159)) * fVar172 +
                       fVar201 * fVar205) * fVar172 +
                      (fVar205 * fVar172 +
                      ((fVar134 * local_398 + fVar159 * local_228) - fVar202) * fVar201) * fVar201)
                      * 3.0;
            fVar109 = (((fVar109 - (fStack_374 * fVar173 + fStack_3c4 * fVar159)) * fVar172 +
                       fVar201 * fVar207) * fVar172 +
                      (fVar207 * fVar172 +
                      ((fVar173 * fStack_394 + fVar159 * fStack_224) - fVar206) * fVar201) * fVar201
                      ) * 3.0;
            fVar110 = (((fVar110 - (fStack_370 * fVar200 + fStack_3c0 * fVar159)) * fVar172 +
                       fVar201 * fVar221) * fVar172 +
                      (fVar221 * fVar172 +
                      ((fVar200 * fStack_390 + fVar159 * fStack_220) - fVar220) * fVar201) * fVar201
                      ) * 3.0;
            pGVar15 = (context->scene->geometries).items[local_3e8].ptr;
            uVar65 = (ray->super_RayK<1>).mask;
            paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
            if ((pGVar15->mask & uVar65) == 0) break;
            fVar172 = fVar135 * local_188 +
                      fVar136 * local_198 + fVar148 * local_1a8 + fVar150 * local_1b8;
            fVar173 = fVar135 * fStack_184 +
                      fVar136 * fStack_194 + fVar148 * fStack_1a4 + fVar150 * fStack_1b4;
            fVar135 = fVar135 * fStack_180 +
                      fVar136 * fStack_190 + fVar148 * fStack_1a0 + fVar150 * fStack_1b0;
            fVar134 = fVar173 * fVar108 - fVar109 * fVar172;
            uVar151 = CONCAT44(fVar172 * fVar110 - fVar108 * fVar135,
                               fVar135 * fVar109 - fVar110 * fVar173);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              (ray->super_RayK<1>).tfar = fVar149;
              *(undefined8 *)&(ray->Ng).field_0 = uVar151;
              (ray->Ng).field_0.field_0.z = fVar134;
              ray->u = fVar201;
              ray->v = fVar159;
              ray->primID = (uint)local_340;
              ray->geomID = (uint)fVar174;
              ray->instID[0] = context->user->instID[0];
              uVar65 = context->user->instPrimID[0];
              ray->instPrimID[0] = uVar65;
              paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar65;
              break;
            }
            local_1f8 = uVar151;
            local_1f0 = fVar134;
            local_1ec = fVar201;
            fStack_1e8 = fVar159;
            local_1e4 = (uint)local_340;
            local_1e0 = fVar174;
            local_1dc = context->user->instID[0];
            local_1d8 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = fVar149;
            local_3dc.m128[0] = -NAN;
            local_298.valid = (int *)&local_3dc;
            local_298.geometryUserPtr = pGVar15->userPtr;
            local_298.context = context->user;
            local_298.ray = (RTCRayN *)ray;
            local_298.hit = (RTCHitN *)&local_1f8;
            local_298.N = 1;
            if ((pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               (local_3b8 = lVar61, (*pGVar15->intersectionFilterN)(&local_298), lVar61 = local_3b8,
               *(float *)local_298.valid != 0.0)) {
              p_Var18 = context->args->filter;
              if ((p_Var18 == (RTCFilterFunctionN)0x0) ||
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar15->field_8).field_0x2 & 0x40) == 0))
                  || ((*p_Var18)(&local_298), *(float *)local_298.valid != 0.0)))) {
                *(float *)((long)local_298.ray + 0x30) = *(float *)local_298.hit;
                *(float *)((long)local_298.ray + 0x34) = *(float *)(local_298.hit + 4);
                *(float *)((long)local_298.ray + 0x38) = *(float *)(local_298.hit + 8);
                *(float *)((long)local_298.ray + 0x3c) = *(float *)(local_298.hit + 0xc);
                *(float *)((long)local_298.ray + 0x40) = *(float *)(local_298.hit + 0x10);
                *(float *)((long)local_298.ray + 0x44) = *(float *)(local_298.hit + 0x14);
                *(float *)((long)local_298.ray + 0x48) = *(float *)(local_298.hit + 0x18);
                *(float *)((long)local_298.ray + 0x4c) = *(float *)(local_298.hit + 0x1c);
                *(float *)((long)local_298.ray + 0x50) = *(float *)(local_298.hit + 0x20);
                paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_298.ray;
                break;
              }
            }
            (ray->super_RayK<1>).tfar = fVar70;
            paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_298.valid;
            break;
          }
          paVar58 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar58 + -1);
          auVar332 = _DAT_01f7b6c0;
        } while (paVar58 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
      }
    }
  }
  goto LAB_00b2e983;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }